

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_modinv64_uint16(uint16_t *out,uint16_t *in,uint16_t *mod)

{
  int64_t *piVar1;
  secp256k1_scalar *a;
  ushort *puVar2;
  uint *puVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  int iVar13;
  uint uVar14;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  uint32_t uVar15;
  uint64_t uVar16;
  byte bVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  secp256k1_modinv32_signed30 *b;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  long lVar22;
  secp256k1_modinv32_signed30 *a_00;
  int *extraout_RDX;
  uint *extraout_RDX_00;
  int32_t *piVar23;
  long lVar24;
  secp256k1_modinv32_signed30 *b_00;
  long *extraout_RDX_01;
  uint uVar25;
  uint uVar26;
  secp256k1_modinv64_modinfo *psVar28;
  int *piVar29;
  secp256k1_modinv32_signed30 *psVar30;
  ulong uVar31;
  uint64_t uVar32;
  ulong uVar33;
  secp256k1_modinv32_signed30 *psVar34;
  secp256k1_fe *psVar35;
  ulong uVar36;
  secp256k1_fe *r;
  uint uVar37;
  secp256k1_modinv64_modinfo *psVar38;
  secp256k1_modinv64_modinfo *psVar39;
  secp256k1_modinv32_signed30 *a_01;
  secp256k1_modinv32_signed30 *a_02;
  long lVar40;
  ulong uVar41;
  secp256k1_fe *r_00;
  secp256k1_fe *psVar42;
  uchar *__s;
  uint uVar43;
  ulong uVar44;
  uint uVar45;
  secp256k1_modinv64_modinfo *psVar46;
  ulong uVar47;
  ulong uVar48;
  int *piVar49;
  char cVar50;
  uint uVar51;
  secp256k1_modinv64_modinfo *psVar52;
  long lVar53;
  secp256k1_modinv32_signed30 *psVar54;
  uint uVar55;
  code *pcVar56;
  int64_t iVar57;
  secp256k1_modinv32_signed30 *psVar58;
  size_t count;
  uint uVar59;
  uint64_t uVar60;
  secp256k1_fe *a_03;
  uint uVar61;
  uint uVar62;
  secp256k1_modinv64_modinfo *psVar63;
  uint64_t uVar64;
  bool bVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  secp256k1_modinv64_signed62 x;
  secp256k1_modinv64_modinfo m;
  uint16_t tmp [16];
  uint16_t negone [16];
  ulong uStack_1738;
  secp256k1_fe *psStack_1730;
  uchar auStack_1728 [4232];
  secp256k1_fe *psStack_6a0;
  ulong uStack_698;
  uint64_t uStack_690;
  secp256k1_fe *psStack_688;
  code *pcStack_680;
  code *pcStack_678;
  undefined1 auStack_670 [36];
  int iStack_64c;
  int iStack_648;
  int iStack_644;
  int iStack_640;
  int iStack_63c;
  int iStack_638;
  int iStack_634;
  undefined1 auStack_630 [48];
  code *pcStack_600;
  long lStack_5f0;
  secp256k1_fe sStack_5e8;
  secp256k1_fe *psStack_5b0;
  secp256k1_fe sStack_5a8;
  secp256k1_fe sStack_578;
  ulong uStack_540;
  ulong uStack_538;
  ulong uStack_530;
  secp256k1_modinv32_signed30 *psStack_528;
  ulong uStack_520;
  code *pcStack_518;
  uint uStack_510;
  uint uStack_50c;
  uint uStack_508;
  uint uStack_504;
  uint uStack_500;
  uint uStack_4fc;
  secp256k1_modinv32_signed30 *psStack_4f8;
  uint uStack_4ec;
  uint uStack_4e8;
  uint uStack_4e4;
  uint uStack_4e0;
  int32_t iStack_4dc;
  secp256k1_modinv32_signed30 *psStack_4d8;
  secp256k1_modinv32_signed30 *psStack_4d0;
  secp256k1_modinv32_signed30 *psStack_4c8;
  secp256k1_modinv32_signed30 *psStack_4c0;
  secp256k1_modinv32_signed30 *psStack_4b8;
  code *pcStack_4b0;
  long lStack_4a0;
  long lStack_498;
  int *piStack_490;
  ulong uStack_488;
  secp256k1_modinv64_modinfo *psStack_480;
  secp256k1_modinv64_modinfo *psStack_470;
  code *pcStack_468;
  secp256k1_modinv32_signed30 *psStack_460;
  int *piStack_450;
  ulong uStack_448;
  secp256k1_modinv64_modinfo *psStack_440;
  secp256k1_modinv64_modinfo *psStack_430;
  code *pcStack_428;
  secp256k1_modinv32_signed30 sStack_420;
  secp256k1_modinv32_signed30 sStack_3fc;
  secp256k1_modinv64_modinfo *psStack_3d8;
  secp256k1_modinv64_modinfo *psStack_3d0;
  secp256k1_modinv64_modinfo *psStack_3c0;
  int iStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  secp256k1_modinv32_trans2x2 sStack_3a8;
  secp256k1_modinv64_modinfo sStack_398;
  long lStack_368;
  undefined8 uStack_360;
  secp256k1_modinv64_modinfo sStack_358;
  undefined1 auStack_328 [40];
  uint64_t uStack_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  secp256k1_modinv64_modinfo *psStack_2e0;
  ulong uStack_2d8;
  secp256k1_modinv64_modinfo *psStack_2d0;
  secp256k1_modinv64_modinfo *psStack_2c8;
  secp256k1_modinv64_modinfo *psStack_2c0;
  secp256k1_modinv64_modinfo *psStack_2b8;
  int iStack_2ac;
  secp256k1_modinv64_modinfo *psStack_2a8;
  secp256k1_modinv32_trans2x2 sStack_2a0;
  secp256k1_modinv64_modinfo sStack_290;
  secp256k1_modinv64_modinfo *psStack_260;
  undefined8 uStack_258;
  secp256k1_modinv64_modinfo sStack_250;
  undefined1 auStack_220 [40];
  uint64_t uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  secp256k1_modinv64_modinfo *psStack_1d8;
  secp256k1_modinv64_modinfo *psStack_1d0;
  secp256k1_modinv64_modinfo *psStack_1c8;
  secp256k1_modinv64_modinfo *psStack_1c0;
  secp256k1_modinv64_modinfo *psStack_1b8;
  code *pcStack_1b0;
  secp256k1_modinv64_modinfo *psStack_1a8;
  int iStack_1a0;
  uint uStack_19c;
  secp256k1_modinv32_trans2x2 sStack_198;
  secp256k1_modinv64_modinfo sStack_188;
  secp256k1_modinv64_modinfo sStack_158;
  secp256k1_modinv64_modinfo *psStack_128;
  secp256k1_modinv64_modinfo *psStack_120;
  secp256k1_modinv64_modinfo *psStack_118;
  secp256k1_modinv64_modinfo *psStack_110;
  uint16_t *puStack_108;
  uint16_t *puStack_100;
  code *pcStack_f8;
  code *pcStack_f0;
  secp256k1_modinv64_modinfo local_e8;
  secp256k1_modinv64_modinfo local_b8;
  secp256k1_modinv64_modinfo local_88;
  uint16_t local_58;
  undefined8 local_56;
  undefined6 uStack_4e;
  undefined2 uStack_48;
  undefined6 uStack_46;
  undefined8 uStack_40;
  secp256k1_modinv64_modinfo *psVar27;
  
  psVar28 = &local_e8;
  psVar39 = &local_e8;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[4] = 0;
  uVar33 = 0;
  uVar31 = 0x8421084210842109;
  do {
    auVar70._8_8_ = 0;
    auVar70._0_8_ = uVar33 >> 1;
    piVar1 = local_e8.modulus.v + ((byte)((uVar33 & 0xffffffff) >> 1) & 0x7f) / 0x1f;
    *piVar1 = *piVar1 | (ulong)((in[uVar33 >> 4 & 0xfffffff] >> ((uint)uVar33 & 0xf) & 1) != 0) <<
                        ((char)(SUB164(auVar70 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)uVar33 & 0x3fU);
    uVar33 = uVar33 + 1;
  } while ((int)uVar33 != 0x100);
  local_e8.modulus_inv62 =
       local_e8.modulus.v[1] | local_e8.modulus.v[0] | local_e8.modulus.v[2] | local_e8.modulus.v[3]
       | local_e8.modulus.v[4];
  local_b8.modulus.v[0] = 0;
  local_b8.modulus.v[1] = 0;
  local_b8.modulus.v[2] = 0;
  local_b8.modulus.v[3] = 0;
  local_b8.modulus.v[4] = 0;
  psVar63 = (secp256k1_modinv64_modinfo *)0x0;
  do {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (ulong)psVar63 >> 1;
    piVar1 = local_b8.modulus.v + ((byte)(((ulong)psVar63 & 0xffffffff) >> 1) & 0x7f) / 0x1f;
    *piVar1 = *piVar1 | (ulong)((mod[(ulong)psVar63 >> 4 & 0xfffffff] >> ((uint)psVar63 & 0xf) & 1)
                               != 0) <<
                        ((char)(SUB164(auVar6 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)psVar63 & 0x3fU);
    iVar57 = local_b8.modulus.v[0];
    psVar63 = (secp256k1_modinv64_modinfo *)((long)(psVar63->modulus).v + 1);
  } while ((int)psVar63 != 0x100);
  pcVar56 = (code *)0x3fffffffffffffff;
  pcStack_f0 = (code *)0x1529e5;
  psVar38 = (secp256k1_modinv64_modinfo *)local_b8.modulus.v[0];
  uVar16 = modinv2p64(local_b8.modulus.v[0]);
  local_b8.modulus_inv62 = uVar16 & 0x3fffffffffffffff;
  psVar52 = (secp256k1_modinv64_modinfo *)(iVar57 * uVar16 & 0x3fffffffffffffff);
  if (psVar52 != (secp256k1_modinv64_modinfo *)0x1) goto LAB_00152e46;
  if (local_e8.modulus_inv62 == 0) {
LAB_00152b5d:
    local_e8.modulus.v[2] = 0;
    local_e8.modulus.v[3] = 0;
    local_e8.modulus.v[0] = 0;
    local_e8.modulus.v[1] = 0;
    local_e8.modulus.v[4] = 0;
    uVar33 = 0;
    do {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar33 >> 1;
      piVar1 = local_e8.modulus.v + ((byte)((uVar33 & 0xffffffff) >> 1) & 0x7f) / 0x1f;
      *piVar1 = *piVar1 | (ulong)((in[uVar33 >> 4 & 0xfffffff] >> ((uint)uVar33 & 0xf) & 1) != 0) <<
                          ((char)(SUB164(auVar9 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                           (char)uVar33 & 0x3fU);
      uVar33 = uVar33 + 1;
    } while ((int)uVar33 != 0x100);
    local_88.modulus_inv62 = (uint64_t)mod;
    iVar13 = 8;
    do {
      uVar33 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
               secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
      uVar47 = uVar33 >> 0x1e;
      uVar33 = uVar33 >> 0x3e;
      lVar53 = local_b8.modulus.v[uVar33];
      if (lVar53 < 1) {
        if (lVar53 < 0) {
          uVar47 = uVar47 + 0x100000000 >> 0x20;
          lVar21 = local_b8.modulus.v[uVar47];
          if (-0x4000000000000000 < lVar21) {
            lVar53 = lVar53 + 0x4000000000000000;
            local_b8.modulus.v[uVar33] = lVar53;
            iVar57 = lVar21 + -1;
            goto LAB_00152c51;
          }
        }
      }
      else {
        uVar47 = uVar47 + 0x100000000 >> 0x20;
        lVar21 = local_b8.modulus.v[uVar47];
        if (lVar21 < 0x4000000000000000) {
          lVar53 = lVar53 + -0x4000000000000000;
          local_b8.modulus.v[uVar33] = lVar53;
          iVar57 = lVar21 + 1;
LAB_00152c51:
          local_b8.modulus.v[uVar47] = iVar57;
        }
      }
      uVar48 = secp256k1_test_state[1] << 0x11;
      uVar47 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar33 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar47;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar33;
      secp256k1_test_state[2] = uVar47 ^ uVar48;
      secp256k1_test_state[3] = uVar33 << 0x2d | uVar33 >> 0x13;
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
    bVar65 = local_e8.modulus_inv62 != 0;
    mod = (uint16_t *)(ulong)bVar65;
    psVar52 = (secp256k1_modinv64_modinfo *)CONCAT71((int7)((ulong)lVar53 >> 8),1);
    while( true ) {
      cVar50 = (char)psVar52;
      pcVar56 = secp256k1_modinv64_var;
      if (cVar50 != '\0') {
        pcVar56 = secp256k1_modinv64;
      }
      pcStack_f0 = (code *)0x152d03;
      (*pcVar56)(&local_e8);
      out[8] = 0;
      out[9] = 0;
      out[10] = 0;
      out[0xb] = 0;
      out[0xc] = 0;
      out[0xd] = 0;
      out[0xe] = 0;
      out[0xf] = 0;
      out[0] = 0;
      out[1] = 0;
      out[2] = 0;
      out[3] = 0;
      out[4] = 0;
      out[5] = 0;
      out[6] = 0;
      out[7] = 0;
      uVar33 = 0;
      do {
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uVar33 >> 1;
        out[uVar33 >> 4 & 0xfffffff] =
             out[uVar33 >> 4 & 0xfffffff] |
             (ushort)(((ulong)local_e8.modulus.v[((byte)((uVar33 & 0xffffffff) >> 1) & 0x7f) / 0x1f]
                       >> ((ulong)((SUB164(auVar10 * ZEXT816(0x8421084210842109),8) >> 4) * 2 +
                                  (int)uVar33) & 0x3f) & 1) != 0) << ((byte)uVar33 & 0xf);
        uVar33 = uVar33 + 1;
      } while ((int)uVar33 != 0x100);
      psVar38 = &local_88;
      pcStack_f0 = (code *)0x152d74;
      psVar63 = (secp256k1_modinv64_modinfo *)out;
      mulmod256((uint16_t *)psVar38,out,in,(uint16_t *)local_88.modulus_inv62);
      if ((ushort)local_88.modulus.v[0] != bVar65) break;
      lVar53 = 1;
      do {
        if (*(short *)((long)local_88.modulus.v + lVar53 * 2) != 0) {
          pcStack_f0 = (code *)0x152e3c;
          test_modinv64_uint16_cold_4();
          goto LAB_00152e3c;
        }
        lVar53 = lVar53 + 1;
      } while (lVar53 != 0x10);
      pcStack_f0 = (code *)0x152da4;
      (*pcVar56)(&local_e8);
      local_88.modulus.v[2] = 0;
      local_88.modulus.v[3] = 0;
      local_88.modulus.v[0] = 0;
      local_88.modulus.v[1] = 0;
      psVar63 = (secp256k1_modinv64_modinfo *)0x0;
      do {
        auVar11._8_8_ = 0;
        auVar11._0_8_ = (ulong)psVar63 >> 1;
        psVar38 = (secp256k1_modinv64_modinfo *)
                  ((ulong)(((ulong)local_e8.modulus.v
                                   [((byte)(((ulong)psVar63 & 0xffffffff) >> 1) & 0x7f) / 0x1f] >>
                            ((ulong)((SUB164(auVar11 * ZEXT816(0x8421084210842109),8) >> 4) * 2 +
                                    (int)psVar63) & 0x3f) & 1) != 0) << ((byte)psVar63 & 0xf));
        puVar2 = (ushort *)((long)local_88.modulus.v + ((ulong)psVar63 >> 4 & 0xfffffff) * 2);
        *puVar2 = *puVar2 | (ushort)psVar38;
        psVar63 = (secp256k1_modinv64_modinfo *)((long)(psVar63->modulus).v + 1);
      } while ((int)psVar63 != 0x100);
      lVar53 = 0;
      do {
        if (*(uint16_t *)((long)local_88.modulus.v + lVar53 * 2) != in[lVar53]) goto LAB_00152e3c;
        lVar53 = lVar53 + 1;
      } while (lVar53 != 0x10);
      psVar52 = (secp256k1_modinv64_modinfo *)0x0;
      if (cVar50 == '\0') {
        return;
      }
    }
    goto LAB_00152e41;
  }
  pcStack_f0 = (code *)0x152a1f;
  mulmod256((uint16_t *)&local_88,in,in,mod);
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[4] = 0;
  uVar33 = 0;
  do {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar33 >> 1;
    piVar1 = local_e8.modulus.v + ((byte)((uVar33 & 0xffffffff) >> 1) & 0x7f) / 0x1f;
    *piVar1 = *piVar1 | (ulong)((*(ushort *)
                                  ((long)local_88.modulus.v + (uVar33 >> 4 & 0xfffffff) * 2) >>
                                 ((uint)uVar33 & 0xf) & 1) != 0) <<
                        ((char)(SUB164(auVar7 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)uVar33 & 0x3fU);
    uVar33 = uVar33 + 1;
  } while ((int)uVar33 != 0x100);
  psVar63 = &local_b8;
  pcStack_f0 = (code *)0x152a95;
  uVar12 = secp256k1_jacobi64_maybe_var(&local_e8.modulus,psVar63);
  if (1 < uVar12) goto LAB_00152e4b;
  local_58 = *mod - 1;
  local_56 = *(undefined8 *)(mod + 1);
  uStack_40 = *(undefined8 *)(mod + 0xc);
  uStack_4e = (undefined6)*(undefined8 *)(mod + 5);
  uStack_48 = (undefined2)*(undefined8 *)(mod + 8);
  uStack_46 = (undefined6)((ulong)*(undefined8 *)(mod + 8) >> 0x10);
  pcStack_f0 = (code *)0x152ace;
  mulmod256((uint16_t *)&local_88,(uint16_t *)&local_88,&local_58,mod);
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[4] = 0;
  uVar33 = 0;
  do {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar33 >> 1;
    piVar1 = local_e8.modulus.v + ((byte)((uVar33 & 0xffffffff) >> 1) & 0x7f) / 0x1f;
    *piVar1 = *piVar1 | (ulong)((*(ushort *)
                                  ((long)local_88.modulus.v + (uVar33 >> 4 & 0xfffffff) * 2) >>
                                 ((uint)uVar33 & 0xf) & 1) != 0) <<
                        ((char)(SUB164(auVar8 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)uVar33 & 0x3fU);
    uVar33 = uVar33 + 1;
  } while ((int)uVar33 != 0x100);
  psVar63 = &local_b8;
  pcStack_f0 = (code *)0x152b44;
  iVar13 = secp256k1_jacobi64_maybe_var(&local_e8.modulus,psVar63);
  if ((iVar13 == 0) || (iVar13 == 1 - (*mod & 2))) goto LAB_00152b5d;
LAB_00152e50:
  pcStack_f0 = modinv2p64;
  test_modinv64_uint16_cold_2();
  if (((ulong)psVar39 & 1) != 0) {
    iVar13 = 6;
    do {
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
    return;
  }
  pcStack_f8 = secp256k1_jacobi32_maybe_var;
  modinv2p64_cold_1();
  pcStack_f8 = (code *)0x8421084210842109;
  puStack_100 = out;
  puStack_108 = in;
  psStack_110 = (secp256k1_modinv64_modinfo *)pcVar56;
  psStack_118 = psVar52;
  psStack_120 = (secp256k1_modinv64_modinfo *)mod;
  sStack_158.modulus.v[4]._0_4_ = (int)(psVar63->modulus).v[4];
  sStack_158.modulus.v[0] = (psVar63->modulus).v[0];
  sStack_158.modulus.v[2] = (psVar63->modulus).v[2];
  sStack_158.modulus.v[3] = (psVar63->modulus).v[3];
  sStack_158.modulus.v[1] = (psVar63->modulus).v[1];
  iVar57 = (psVar39->modulus).v[0];
  sStack_188.modulus.v[1] = (psVar39->modulus).v[1];
  piVar1 = (psVar39->modulus).v + 2;
  sStack_188.modulus.v[2] = *piVar1;
  sStack_188.modulus.v[3] = (psVar39->modulus).v[3];
  sStack_188.modulus.v[0]._0_4_ = (uint)iVar57;
  sStack_188.modulus.v[0]._4_4_ = (uint)((ulong)iVar57 >> 0x20);
  sStack_188.modulus.v[4]._0_4_ = (int)(psVar39->modulus).v[4];
  auVar70 = packssdw(*(undefined1 (*) [16])(psVar39->modulus).v,*(undefined1 (*) [16])piVar1);
  if (((((((((auVar70 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar70 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar70 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar70 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar70 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar70 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar70 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar70[0xf]) &&
     (-1 < (int)sStack_188.modulus.v[4])) {
    uVar12 = (uint)((ulong)sStack_188.modulus.v[1] >> 0x20) | (uint)sStack_188.modulus.v[1] |
             sStack_188.modulus.v[0]._4_4_ | (uint)sStack_188.modulus.v[0];
    psVar46 = (secp256k1_modinv64_modinfo *)(ulong)uVar12;
    psVar28 = psVar52;
    psVar38 = psVar63;
    if (((int)((ulong)sStack_188.modulus.v[3] >> 0x20) != 0 ||
        (((int)sStack_188.modulus.v[3] != 0 ||
         ((int)((ulong)sStack_188.modulus.v[2] >> 0x20) != 0 || (int)sStack_188.modulus.v[2] != 0))
        || uVar12 != 0)) || (int)sStack_188.modulus.v[4] != 0) {
      psStack_1a8 = (secp256k1_modinv64_modinfo *)0x9;
      uVar31 = 0xffffffff;
      iStack_1a0 = 0;
      mod = (uint16_t *)(sStack_158.modulus.v[0] & 0xffffffff);
      out = (uint16_t *)0x0;
      psStack_128 = psVar63;
      do {
        psVar38 = psStack_128;
        psVar28 = psStack_1a8;
        uStack_19c = sStack_188.modulus.v[0]._4_4_ << 0x1e | (uint)sStack_188.modulus.v[0];
        uVar51 = sStack_158.modulus.v[0]._4_4_ << 0x1e | (uint)mod;
        psVar52 = (secp256k1_modinv64_modinfo *)(ulong)uVar51;
        uVar12 = 1;
        psVar46 = (secp256k1_modinv64_modinfo *)0x0;
        uVar14 = 0x1e;
        psVar39 = (secp256k1_modinv64_modinfo *)0x0;
        uVar43 = 1;
        mod = (uint16_t *)psVar52;
        uVar45 = uStack_19c;
        while( true ) {
          in = out;
          psVar63 = (secp256k1_modinv64_modinfo *)(ulong)uStack_19c;
          pcVar56 = (code *)&sStack_188;
          uVar55 = (uint)mod;
          uVar25 = -1 << ((byte)uVar14 & 0x1f) | uVar45;
          uVar18 = 0;
          if (uVar25 != 0) {
            for (; (uVar25 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
            }
          }
          bVar17 = (byte)uVar18;
          uVar45 = uVar45 >> (bVar17 & 0x1f);
          uVar43 = uVar43 << (bVar17 & 0x1f);
          uVar37 = (int)psVar39 << (bVar17 & 0x1f);
          psVar39 = (secp256k1_modinv64_modinfo *)(ulong)uVar37;
          uVar25 = (int)uVar31 - uVar18;
          uVar31 = (ulong)uVar25;
          psVar27 = (secp256k1_modinv64_modinfo *)((ulong)mod >> 1);
          uVar61 = ((uint)((ulong)mod >> 2) ^ (uint)psVar27) & uVar18 ^ (uint)in;
          out = (uint16_t *)(ulong)uVar61;
          uVar14 = uVar14 - uVar18;
          uVar18 = (uint)psVar46;
          if (uVar14 == 0) break;
          if (((ulong)mod & 1) == 0) {
            pcStack_1b0 = (code *)0x15329b;
            secp256k1_jacobi32_maybe_var_cold_6();
LAB_0015329b:
            pcStack_1b0 = (code *)0x1532a0;
            secp256k1_jacobi32_maybe_var_cold_5();
LAB_001532a0:
            pcStack_1b0 = (code *)0x1532a5;
            secp256k1_jacobi32_maybe_var_cold_1();
LAB_001532a5:
            mod = (uint16_t *)psVar27;
            pcStack_1b0 = (code *)0x1532aa;
            secp256k1_jacobi32_maybe_var_cold_2();
            psVar46 = psVar52;
LAB_001532aa:
            psVar52 = psVar46;
            pcStack_1b0 = (code *)0x1532af;
            secp256k1_jacobi32_maybe_var_cold_4();
            goto LAB_001532af;
          }
          if ((uVar45 & 1) == 0) goto LAB_0015329b;
          uVar26 = uVar37 * uStack_19c + uVar43 * uVar51;
          psVar27 = (secp256k1_modinv64_modinfo *)(ulong)uVar26;
          bVar17 = 0x1e - (char)uVar14;
          uVar59 = uVar55 << (bVar17 & 0x1f);
          in = (uint16_t *)(ulong)uVar59;
          if (uVar26 != uVar59) goto LAB_001532a0;
          uVar59 = uVar12 * uStack_19c + uVar18 * uVar51;
          in = (uint16_t *)(ulong)uVar59;
          uVar26 = uVar45 << (bVar17 & 0x1f);
          psVar27 = (secp256k1_modinv64_modinfo *)(ulong)uVar26;
          if (uVar59 != uVar26) goto LAB_001532a5;
          in = (uint16_t *)psVar46;
          if ((int)uVar25 < 0) {
            uVar31 = (ulong)-uVar25;
            out = (uint16_t *)(ulong)(uVar61 ^ (uVar45 & uVar55) >> 1);
            mod = (uint16_t *)(ulong)uVar45;
            psVar39 = (secp256k1_modinv64_modinfo *)(ulong)uVar12;
            in = (uint16_t *)(ulong)uVar43;
            uVar43 = uVar18;
            uVar45 = uVar55;
            uVar12 = uVar37;
          }
          uVar18 = (int)uVar31 + 1;
          if ((int)uVar14 <= (int)uVar18) {
            uVar18 = uVar14;
          }
          psVar63 = psVar52;
          psVar46 = (secp256k1_modinv64_modinfo *)(ulong)uVar12;
          if (0x1e < uVar18) goto LAB_001532aa;
          uVar55 = (uint)(0xff << (-(char)uVar18 & 0x1fU)) >> (-(char)uVar18 & 0x1fU);
          uVar18 = secp256k1_modinv32_inv256[(uint)((ulong)mod >> 1) & 0x7f] * uVar45 & uVar55;
          uVar45 = uVar18 * (int)mod + uVar45;
          psVar46 = (secp256k1_modinv64_modinfo *)(ulong)(uVar18 * uVar43 + (int)in);
          uVar12 = uVar18 * (int)psVar39 + uVar12;
          psVar63 = (secp256k1_modinv64_modinfo *)(ulong)uStack_19c;
          if ((uVar45 & uVar55) != 0) {
LAB_001532af:
            pcVar56 = (code *)&sStack_188;
            pcStack_1b0 = (code *)0x1532b4;
            secp256k1_jacobi32_maybe_var_cold_3();
            goto LAB_001532b4;
          }
        }
        lVar53 = (long)(int)uVar12 * (long)(int)uVar43 - (long)(int)uVar18 * (long)(int)uVar37;
        mod = (uint16_t *)&sStack_158;
        sStack_198.u = uVar43;
        sStack_198.v = uVar37;
        sStack_198.q = uVar18;
        sStack_198.r = uVar12;
        if ((lVar53 != -0x40000000) && (lVar53 != 0x40000000)) goto LAB_001532e6;
        iVar19 = (int)psStack_1a8;
        psVar63 = (secp256k1_modinv64_modinfo *)((ulong)psStack_1a8 & 0xffffffff);
        pcStack_1b0 = (code *)0x153138;
        psVar39 = (secp256k1_modinv64_modinfo *)mod;
        iVar13 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)mod,iVar19,
                            (secp256k1_modinv32_signed30 *)psStack_128,0);
        if (iVar13 < 1) goto LAB_001532b9;
        psVar63 = (secp256k1_modinv64_modinfo *)((ulong)psVar28 & 0xffffffff);
        pcStack_1b0 = (code *)0x153153;
        psVar39 = (secp256k1_modinv64_modinfo *)mod;
        iVar13 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)mod,iVar19,
                            (secp256k1_modinv32_signed30 *)psVar38,1);
        if (0 < iVar13) goto LAB_001532be;
        psVar63 = (secp256k1_modinv64_modinfo *)((ulong)psVar28 & 0xffffffff);
        pcStack_1b0 = (code *)0x15316b;
        psVar39 = (secp256k1_modinv64_modinfo *)pcVar56;
        iVar13 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar56,iVar19,
                            (secp256k1_modinv32_signed30 *)psVar38,0);
        if (iVar13 < 1) goto LAB_001532c3;
        psVar63 = (secp256k1_modinv64_modinfo *)((ulong)psVar28 & 0xffffffff);
        pcStack_1b0 = (code *)0x153186;
        psVar39 = (secp256k1_modinv64_modinfo *)pcVar56;
        iVar13 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar56,iVar19,
                            (secp256k1_modinv32_signed30 *)psVar38,1);
        if (-1 < iVar13) goto LAB_001532c8;
        pcStack_1b0 = (code *)0x1531a1;
        secp256k1_modinv32_update_fg_30_var
                  (iVar19,(secp256k1_modinv32_signed30 *)mod,(secp256k1_modinv32_signed30 *)pcVar56,
                   &sStack_198);
        mod = (uint16_t *)(sStack_158.modulus.v[0] & 0xffffffff);
        if ((int)sStack_158.modulus.v[0] == 1) {
          if (iVar19 < 2) {
            return;
          }
          uVar12 = 0;
          uVar33 = 1;
          do {
            uVar12 = uVar12 | *(uint *)((long)sStack_158.modulus.v + uVar33 * 4);
            uVar33 = uVar33 + 1;
          } while (((ulong)psVar28 & 0xffffffff) != uVar33);
          psVar28 = psStack_1a8;
          if (uVar12 == 0) {
            return;
          }
        }
        iVar13 = (int)psVar28;
        psVar28 = (secp256k1_modinv64_modinfo *)((ulong)psVar28 & 0xffffffff);
        if ((-1 < iVar13 + -2 && *(int *)((long)sStack_158.modulus.v + (long)iVar13 * 4 + -4) == 0)
            && *(int *)((long)sStack_188.modulus.v + (long)iVar13 * 4 + -4) == 0) {
          psVar28 = (secp256k1_modinv64_modinfo *)(ulong)(iVar13 - 1);
        }
        pcVar56 = (code *)&sStack_158;
        pcStack_1b0 = (code *)0x153207;
        iVar19 = (int)psVar28;
        psVar63 = psVar28;
        psVar39 = (secp256k1_modinv64_modinfo *)pcVar56;
        iVar13 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar56,iVar19,
                            (secp256k1_modinv32_signed30 *)psVar38,0);
        if (iVar13 < 1) goto LAB_001532cd;
        pcStack_1b0 = (code *)0x153222;
        psVar63 = psVar28;
        psVar39 = (secp256k1_modinv64_modinfo *)pcVar56;
        iVar13 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar56,iVar19,
                            (secp256k1_modinv32_signed30 *)psVar38,1);
        if (0 < iVar13) goto LAB_001532d2;
        pcVar56 = (code *)&sStack_188;
        pcStack_1b0 = (code *)0x15323f;
        psVar63 = psVar28;
        psVar39 = (secp256k1_modinv64_modinfo *)pcVar56;
        iVar13 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar56,iVar19,
                            (secp256k1_modinv32_signed30 *)psVar38,0);
        if (iVar13 < 1) goto LAB_001532d7;
        pcStack_1b0 = (code *)0x15325e;
        psVar63 = psVar28;
        psVar39 = (secp256k1_modinv64_modinfo *)pcVar56;
        psStack_1a8 = psVar28;
        iVar13 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)pcVar56,iVar19,
                            (secp256k1_modinv32_signed30 *)psVar38,1);
        if (-1 < iVar13) goto LAB_001532dc;
        iStack_1a0 = iStack_1a0 + 1;
        if (iStack_1a0 == 0x19) {
          return;
        }
      } while( true );
    }
  }
  else {
LAB_001532b4:
    pcStack_1b0 = (code *)0x1532b9;
    secp256k1_jacobi32_maybe_var_cold_17();
    psVar28 = psVar52;
    psVar38 = (secp256k1_modinv64_modinfo *)in;
LAB_001532b9:
    pcStack_1b0 = (code *)0x1532be;
    secp256k1_jacobi32_maybe_var_cold_14();
LAB_001532be:
    pcStack_1b0 = (code *)0x1532c3;
    secp256k1_jacobi32_maybe_var_cold_13();
LAB_001532c3:
    pcStack_1b0 = (code *)0x1532c8;
    secp256k1_jacobi32_maybe_var_cold_12();
LAB_001532c8:
    pcStack_1b0 = (code *)0x1532cd;
    secp256k1_jacobi32_maybe_var_cold_11();
LAB_001532cd:
    pcStack_1b0 = (code *)0x1532d2;
    secp256k1_jacobi32_maybe_var_cold_10();
LAB_001532d2:
    pcStack_1b0 = (code *)0x1532d7;
    secp256k1_jacobi32_maybe_var_cold_9();
LAB_001532d7:
    pcStack_1b0 = (code *)0x1532dc;
    secp256k1_jacobi32_maybe_var_cold_8();
LAB_001532dc:
    pcStack_1b0 = (code *)0x1532e1;
    secp256k1_jacobi32_maybe_var_cold_7();
    psVar46 = psVar63;
  }
  psVar63 = psVar46;
  pcStack_1b0 = (code *)0x1532e6;
  secp256k1_jacobi32_maybe_var_cold_16();
LAB_001532e6:
  pcStack_1b0 = secp256k1_modinv32_var;
  secp256k1_jacobi32_maybe_var_cold_15();
  pcStack_1b0 = (code *)uVar31;
  psStack_1b8 = (secp256k1_modinv64_modinfo *)out;
  psStack_1c0 = psVar38;
  psStack_1c8 = (secp256k1_modinv64_modinfo *)pcVar56;
  psStack_1d0 = psVar28;
  psStack_1d8 = (secp256k1_modinv64_modinfo *)mod;
  auStack_220._16_8_ = 0;
  auStack_220._24_8_ = 0;
  auStack_220._0_8_ = 0;
  auStack_220._8_8_ = 0;
  auStack_220._32_4_ = 0;
  uStack_1e8 = 0;
  uStack_1e0 = 0;
  uStack_1f8 = 0;
  uStack_1f0 = 0;
  auStack_220._36_4_ = 1;
  sStack_290.modulus.v[4]._0_4_ = (int)(psVar63->modulus).v[4];
  uStack_258 = psVar63;
  sStack_290.modulus.v[2] = (psVar63->modulus).v[2];
  sStack_290.modulus.v[3] = (psVar63->modulus).v[3];
  sStack_290.modulus.v[0] = (psVar63->modulus).v[0];
  sStack_290.modulus.v[1] = (psVar63->modulus).v[1];
  sStack_250.modulus.v[4]._0_4_ = (int)(psVar39->modulus).v[4];
  sStack_250.modulus.v[0] = (psVar39->modulus).v[0];
  sStack_250.modulus.v[1] = (psVar39->modulus).v[1];
  psStack_260 = psVar39;
  sStack_250.modulus.v[2] = (psVar39->modulus).v[2];
  sStack_250.modulus.v[3] = (psVar39->modulus).v[3];
  iStack_2ac = 0;
  uVar31 = 0xffffffff;
  psStack_2a8 = (secp256k1_modinv64_modinfo *)0x9;
LAB_00153380:
  psVar28 = uStack_258;
  psVar63 = psStack_2a8;
  psVar52 = (secp256k1_modinv64_modinfo *)(sStack_290.modulus.v[0] & 0xffffffff);
  psVar39 = (secp256k1_modinv64_modinfo *)(sStack_250.modulus.v[0] & 0xffffffff);
  uVar12 = 1;
  psVar46 = (secp256k1_modinv64_modinfo *)0x0;
  iVar13 = 0x1e;
  uVar14 = 0;
  psVar38 = (secp256k1_modinv64_modinfo *)0x1;
  uVar43 = (uint)sStack_290.modulus.v[0];
  uVar45 = (uint)sStack_250.modulus.v[0];
  while( true ) {
    uVar51 = -1 << ((byte)iVar13 & 0x1f) | uVar45;
    iVar19 = 0;
    if (uVar51 != 0) {
      for (; (uVar51 >> iVar19 & 1) == 0; iVar19 = iVar19 + 1) {
      }
    }
    bVar17 = (byte)iVar19;
    uVar45 = uVar45 >> (bVar17 & 0x1f);
    uVar18 = (int)psVar38 << (bVar17 & 0x1f);
    psVar38 = (secp256k1_modinv64_modinfo *)(ulong)uVar18;
    uVar14 = uVar14 << (bVar17 & 0x1f);
    uVar55 = (int)uVar31 - iVar19;
    uVar31 = (ulong)uVar55;
    iVar13 = iVar13 - iVar19;
    iVar19 = (int)psVar46;
    if (iVar13 == 0) break;
    if ((uVar43 & 1) == 0) {
      psStack_2b8 = (secp256k1_modinv64_modinfo *)0x1537a7;
      secp256k1_modinv32_var_cold_7();
LAB_001537a7:
      psStack_2b8 = (secp256k1_modinv64_modinfo *)0x1537ac;
      secp256k1_modinv32_var_cold_6();
LAB_001537ac:
      psVar27 = (secp256k1_modinv64_modinfo *)(ulong)uVar51;
      psStack_2b8 = (secp256k1_modinv64_modinfo *)0x1537b1;
      secp256k1_modinv32_var_cold_1();
LAB_001537b1:
      psStack_2b8 = (secp256k1_modinv64_modinfo *)0x1537b6;
      secp256k1_modinv32_var_cold_2();
LAB_001537b6:
      psStack_2b8 = (secp256k1_modinv64_modinfo *)0x1537bb;
      secp256k1_modinv32_var_cold_5();
LAB_001537bb:
      psStack_2b8 = (secp256k1_modinv64_modinfo *)0x1537c0;
      secp256k1_modinv32_var_cold_4();
      goto LAB_001537c0;
    }
    if ((uVar45 & 1) == 0) goto LAB_001537a7;
    uVar51 = uVar14 * (uint)sStack_250.modulus.v[0] + uVar18 * (uint)sStack_290.modulus.v[0];
    bVar17 = 0x1e - (char)iVar13;
    uVar25 = uVar43 << (bVar17 & 0x1f);
    pcVar56 = (code *)(ulong)uVar25;
    if (uVar51 != uVar25) goto LAB_001537ac;
    uVar51 = uVar12 * (uint)sStack_250.modulus.v[0] + iVar19 * (uint)sStack_290.modulus.v[0];
    pcVar56 = (code *)(ulong)uVar51;
    uVar25 = uVar45 << (bVar17 & 0x1f);
    psVar27 = (secp256k1_modinv64_modinfo *)(ulong)uVar25;
    if (uVar51 != uVar25) goto LAB_001537b1;
    if (uVar55 - 0x2f0 < 0xfffffa21) goto LAB_001537b6;
    psVar27 = psVar46;
    if ((int)uVar55 < 0) {
      uVar31 = (ulong)-uVar55;
      uVar51 = -uVar43;
      uVar55 = -uVar14;
      psVar38 = psVar46;
      psVar27 = (secp256k1_modinv64_modinfo *)(ulong)-uVar18;
      uVar43 = uVar45;
      uVar45 = uVar51;
      uVar14 = uVar12;
      uVar12 = uVar55;
    }
    pcVar56 = (code *)(ulong)uVar12;
    iVar19 = (int)uVar31 + 1;
    if (iVar13 <= iVar19) {
      iVar19 = iVar13;
    }
    if (iVar19 - 0x1fU < 0xffffffe2) goto LAB_001537bb;
    uVar18 = (uint)(0xff << (-(char)iVar19 & 0x1fU)) >> (-(char)iVar19 & 0x1fU);
    out = (uint16_t *)(ulong)uVar18;
    uVar51 = secp256k1_modinv32_inv256[uVar43 >> 1 & 0x7f] * uVar45 & uVar18;
    uVar45 = uVar45 + uVar51 * uVar43;
    psVar46 = (secp256k1_modinv64_modinfo *)(ulong)(uVar51 * (int)psVar38 + (int)psVar27);
    uVar12 = uVar51 * uVar14 + uVar12;
    if ((uVar45 & uVar18) != 0) {
LAB_001537c0:
      psStack_2b8 = (secp256k1_modinv64_modinfo *)0x1537c5;
      secp256k1_modinv32_var_cold_3();
      psVar63 = psVar27;
      goto LAB_001537c5;
    }
  }
  sStack_2a0.u = uVar18;
  sStack_2a0.v = uVar14;
  sStack_2a0.q = iVar19;
  sStack_2a0.r = uVar12;
  if ((long)(int)uVar12 * (long)(int)uVar18 - (long)iVar19 * (long)(int)uVar14 == 0x40000000) {
    psStack_2b8 = (secp256k1_modinv64_modinfo *)0x153526;
    secp256k1_modinv32_update_de_30
              ((secp256k1_modinv32_signed30 *)auStack_220,
               (secp256k1_modinv32_signed30 *)(auStack_220 + 0x24),&sStack_2a0,
               (secp256k1_modinv32_modinfo *)uStack_258);
    out = (uint16_t *)&sStack_290;
    iVar19 = (int)psVar63;
    psStack_2b8 = (secp256k1_modinv64_modinfo *)0x15353e;
    psVar52 = psVar63;
    psVar39 = (secp256k1_modinv64_modinfo *)out;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)out,iVar19,
                        (secp256k1_modinv32_signed30 *)psVar28,-1);
    if (iVar13 < 1) goto LAB_001537ca;
    psStack_2b8 = (secp256k1_modinv64_modinfo *)0x153559;
    psVar52 = psVar63;
    psVar39 = (secp256k1_modinv64_modinfo *)out;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)out,iVar19,
                        (secp256k1_modinv32_signed30 *)psVar28,1);
    if (0 < iVar13) goto LAB_001537cf;
    psStack_2b8 = (secp256k1_modinv64_modinfo *)0x153574;
    psVar52 = psVar63;
    psVar39 = &sStack_250;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_250,iVar19,
                        (secp256k1_modinv32_signed30 *)psVar28,-1);
    if (iVar13 < 1) goto LAB_001537d4;
    psStack_2b8 = (secp256k1_modinv64_modinfo *)0x15358f;
    psVar52 = psVar63;
    psVar39 = &sStack_250;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_250,iVar19,
                        (secp256k1_modinv32_signed30 *)psVar28,1);
    if (-1 < iVar13) goto LAB_001537d9;
    psStack_2b8 = (secp256k1_modinv64_modinfo *)0x1535ac;
    secp256k1_modinv32_update_fg_30_var
              (iVar19,(secp256k1_modinv32_signed30 *)&sStack_290,
               (secp256k1_modinv32_signed30 *)&sStack_250,&sStack_2a0);
    if ((uint)sStack_250.modulus.v[0] == 0) {
      if (1 < iVar19) {
        uVar12 = 0;
        psVar39 = (secp256k1_modinv64_modinfo *)0x1;
        do {
          uVar12 = uVar12 | *(uint *)((long)sStack_250.modulus.v + (long)psVar39 * 4);
          psVar39 = (secp256k1_modinv64_modinfo *)((long)(psVar39->modulus).v + 1);
        } while (psVar63 != psVar39);
        if (uVar12 != 0) goto LAB_001535db;
      }
      psVar39 = &sStack_250;
      psStack_2b8 = (secp256k1_modinv64_modinfo *)0x1536b7;
      psVar52 = psVar63;
      iVar13 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)psVar39,iVar19,&SECP256K1_SIGNED30_ONE,0);
      psVar38 = psVar63;
      if (iVar13 != 0) goto LAB_001537f7;
      psStack_2b8 = (secp256k1_modinv64_modinfo *)0x1536d8;
      iVar13 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)&sStack_290,iVar19,&SECP256K1_SIGNED30_ONE,
                          -1);
      psVar38 = psStack_260;
      if (iVar13 != 0) {
        psStack_2b8 = (secp256k1_modinv64_modinfo *)0x1536fd;
        iVar13 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)&sStack_290,iVar19,
                            &SECP256K1_SIGNED30_ONE,1);
        if (iVar13 != 0) {
          psVar52 = (secp256k1_modinv64_modinfo *)0x9;
          psStack_2b8 = (secp256k1_modinv64_modinfo *)0x153717;
          psVar39 = psVar38;
          iVar13 = secp256k1_modinv32_mul_cmp_30
                             ((secp256k1_modinv32_signed30 *)psVar38,9,&SECP256K1_SIGNED30_ONE,0);
          if (iVar13 != 0) goto LAB_001537fc;
          psVar39 = (secp256k1_modinv64_modinfo *)auStack_220;
          psVar52 = (secp256k1_modinv64_modinfo *)0x9;
          psStack_2b8 = (secp256k1_modinv64_modinfo *)0x15373a;
          iVar13 = secp256k1_modinv32_mul_cmp_30
                             ((secp256k1_modinv32_signed30 *)psVar39,9,&SECP256K1_SIGNED30_ONE,0);
          if (iVar13 != 0) goto LAB_001537fc;
          psVar39 = &sStack_290;
          psStack_2b8 = (secp256k1_modinv64_modinfo *)0x153757;
          psVar52 = psVar63;
          iVar13 = secp256k1_modinv32_mul_cmp_30
                             ((secp256k1_modinv32_signed30 *)psVar39,iVar19,
                              (secp256k1_modinv32_signed30 *)psVar28,1);
          if (iVar13 != 0) goto LAB_001537fc;
        }
      }
      psStack_2b8 = (secp256k1_modinv64_modinfo *)0x153779;
      secp256k1_modinv32_normalize_30
                ((secp256k1_modinv32_signed30 *)auStack_220,
                 *(int32_t *)((long)sStack_290.modulus.v + (long)iVar19 * 4 + -4),
                 (secp256k1_modinv32_modinfo *)psVar28);
      *(undefined4 *)((psVar38->modulus).v + 4) = auStack_220._32_4_;
      (psVar38->modulus).v[2] = auStack_220._16_8_;
      (psVar38->modulus).v[3] = auStack_220._24_8_;
      (psVar38->modulus).v[0] = auStack_220._0_8_;
      (psVar38->modulus).v[1] = auStack_220._8_8_;
      return;
    }
LAB_001535db:
    uVar12 = *(uint *)((long)sStack_290.modulus.v + (long)iVar19 * 4 + -4);
    uVar43 = *(uint *)((long)&uStack_258 + (long)iVar19 * 4 + 4);
    iVar13 = iVar19 + -2;
    uVar45 = (int)uVar12 >> 0x1f ^ uVar12 | iVar13 >> 0x1f;
    psVar39 = (secp256k1_modinv64_modinfo *)(ulong)uVar45;
    uVar45 = (int)uVar43 >> 0x1f ^ uVar43 | uVar45;
    psVar52 = (secp256k1_modinv64_modinfo *)(ulong)uVar45;
    if (uVar45 == 0) {
      psVar63 = (secp256k1_modinv64_modinfo *)(ulong)(iVar19 - 1);
      puVar3 = (uint *)((long)sStack_290.modulus.v + (long)iVar13 * 4);
      *puVar3 = *puVar3 | uVar12 << 0x1e;
      puVar3 = (uint *)((long)sStack_250.modulus.v + (long)iVar13 * 4);
      *puVar3 = *puVar3 | uVar43 << 0x1e;
    }
    out = (uint16_t *)&sStack_290;
    if (iStack_2ac == 0x18) goto LAB_001537de;
    iVar19 = (int)psVar63;
    psStack_2b8 = (secp256k1_modinv64_modinfo *)0x15363a;
    psVar52 = psVar63;
    psVar39 = (secp256k1_modinv64_modinfo *)out;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)out,iVar19,
                        (secp256k1_modinv32_signed30 *)psVar28,-1);
    if (iVar13 < 1) goto LAB_001537e3;
    psStack_2b8 = (secp256k1_modinv64_modinfo *)0x153655;
    psVar52 = psVar63;
    psVar39 = (secp256k1_modinv64_modinfo *)out;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)out,iVar19,
                        (secp256k1_modinv32_signed30 *)psVar28,1);
    if (0 < iVar13) goto LAB_001537e8;
    psStack_2b8 = (secp256k1_modinv64_modinfo *)0x153670;
    psVar52 = psVar63;
    psVar39 = &sStack_250;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_250,iVar19,
                        (secp256k1_modinv32_signed30 *)psVar28,-1);
    if (iVar13 < 1) goto LAB_001537ed;
    psStack_2b8 = (secp256k1_modinv64_modinfo *)0x15368b;
    psVar52 = psVar63;
    psVar39 = &sStack_250;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_250,iVar19,
                        (secp256k1_modinv32_signed30 *)psVar28,1);
    if (-1 < iVar13) goto LAB_001537f2;
    iStack_2ac = iStack_2ac + 1;
    psStack_2a8 = psVar63;
    goto LAB_00153380;
  }
LAB_001537c5:
  psStack_2b8 = (secp256k1_modinv64_modinfo *)0x1537ca;
  secp256k1_modinv32_var_cold_8();
  psVar28 = psVar38;
LAB_001537ca:
  psStack_2b8 = (secp256k1_modinv64_modinfo *)0x1537cf;
  secp256k1_modinv32_var_cold_19();
LAB_001537cf:
  psStack_2b8 = (secp256k1_modinv64_modinfo *)0x1537d4;
  secp256k1_modinv32_var_cold_18();
LAB_001537d4:
  psStack_2b8 = (secp256k1_modinv64_modinfo *)0x1537d9;
  secp256k1_modinv32_var_cold_17();
LAB_001537d9:
  psStack_2b8 = (secp256k1_modinv64_modinfo *)0x1537de;
  secp256k1_modinv32_var_cold_16();
LAB_001537de:
  psStack_2b8 = (secp256k1_modinv64_modinfo *)0x1537e3;
  secp256k1_modinv32_var_cold_13();
LAB_001537e3:
  psStack_2b8 = (secp256k1_modinv64_modinfo *)0x1537e8;
  secp256k1_modinv32_var_cold_12();
LAB_001537e8:
  psStack_2b8 = (secp256k1_modinv64_modinfo *)0x1537ed;
  secp256k1_modinv32_var_cold_11();
LAB_001537ed:
  psStack_2b8 = (secp256k1_modinv64_modinfo *)0x1537f2;
  secp256k1_modinv32_var_cold_10();
LAB_001537f2:
  psStack_2b8 = (secp256k1_modinv64_modinfo *)0x1537f7;
  secp256k1_modinv32_var_cold_9();
  psVar38 = psVar63;
LAB_001537f7:
  psVar63 = (secp256k1_modinv64_modinfo *)out;
  psStack_2b8 = (secp256k1_modinv64_modinfo *)0x1537fc;
  secp256k1_modinv32_var_cold_14();
LAB_001537fc:
  psStack_2b8 = (secp256k1_modinv64_modinfo *)secp256k1_modinv32;
  secp256k1_modinv32_var_cold_15();
  psStack_2b8 = &sStack_250;
  psStack_2c0 = psVar63;
  psStack_2c8 = psVar38;
  psStack_2d0 = (secp256k1_modinv64_modinfo *)pcVar56;
  uStack_2d8 = uVar31;
  psStack_2e0 = psVar28;
  auStack_328._16_8_ = 0;
  auStack_328._24_8_ = 0;
  auStack_328._0_8_ = 0;
  auStack_328._8_8_ = 0;
  auStack_328._32_4_ = 0;
  uStack_2f0 = 0;
  uStack_2e8 = 0;
  uStack_300 = 0;
  uStack_2f8 = 0;
  auStack_328._36_4_ = 1;
  sStack_398.modulus.v[4]._0_4_ = (int32_t)(psVar52->modulus).v[4];
  sStack_398.modulus.v[2] = (psVar52->modulus).v[2];
  sStack_398.modulus.v[3] = (psVar52->modulus).v[3];
  sStack_398.modulus.v[0] = (psVar52->modulus).v[0];
  sStack_398.modulus.v[1] = (psVar52->modulus).v[1];
  sStack_358.modulus.v[4]._0_4_ = (int)(psVar39->modulus).v[4];
  sStack_358.modulus.v[0] = (psVar39->modulus).v[0];
  sStack_358.modulus.v[1] = (psVar39->modulus).v[1];
  sStack_398.modulus_inv62 = (uint64_t)psVar39;
  sStack_358.modulus.v[2] = (psVar39->modulus).v[2];
  sStack_358.modulus.v[3] = (psVar39->modulus).v[3];
  iVar13 = 0;
  uVar31 = 0xffffffff;
  psStack_3c0 = psVar52;
  do {
    uStack_360 = (ulong)(int)(uint)sStack_398.modulus.v[0];
    uVar47 = (ulong)(int)(uint)sStack_358.modulus.v[0];
    uVar33 = 0;
    psVar39 = (secp256k1_modinv64_modinfo *)0x1;
    uVar12 = 0;
    uVar14 = 0;
    uVar51 = 1;
    uVar43 = (uint)sStack_358.modulus.v[0];
    uVar45 = (uint)sStack_398.modulus.v[0];
    do {
      uVar18 = (uint)sStack_398.modulus.v[0];
      iStack_3b4 = iVar13;
      if ((uVar45 & 1) == 0) {
        psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153cbf;
        secp256k1_modinv32_cold_17();
LAB_00153cbf:
        psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153cc4;
        secp256k1_modinv32_cold_1();
LAB_00153cc4:
        psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153cc9;
        secp256k1_modinv32_cold_2();
        psVar52 = (secp256k1_modinv64_modinfo *)pcVar56;
LAB_00153cc9:
        uVar51 = uVar18;
        psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153cce;
        secp256k1_modinv32_cold_16();
        goto LAB_00153cce;
      }
      uVar25 = (uint)psVar39;
      uVar37 = uVar12 * (uint)sStack_358.modulus.v[0] + uVar25 * (uint)sStack_398.modulus.v[0];
      psVar38 = (secp256k1_modinv64_modinfo *)(ulong)uVar37;
      uVar55 = uVar45 << ((byte)uVar33 & 0x1f);
      psVar28 = (secp256k1_modinv64_modinfo *)(ulong)uVar55;
      if (uVar37 != uVar55) goto LAB_00153cbf;
      uVar37 = uVar51 * (uint)sStack_358.modulus.v[0] + uVar14 * (uint)sStack_398.modulus.v[0];
      psVar38 = (secp256k1_modinv64_modinfo *)(ulong)uVar37;
      uVar55 = uVar43 << ((byte)uVar33 & 0x1f);
      psVar28 = (secp256k1_modinv64_modinfo *)(ulong)uVar55;
      if (uVar37 != uVar55) goto LAB_00153cc4;
      uStack_3ac = (int)(uint)uVar31 >> 0x1f;
      psVar38 = (secp256k1_modinv64_modinfo *)(ulong)uStack_3ac;
      uStack_3b0 = uVar43 & 1;
      uVar55 = -uStack_3b0;
      psVar63 = (secp256k1_modinv64_modinfo *)(ulong)uVar55;
      uVar37 = uStack_3ac & uVar55;
      psVar28 = (secp256k1_modinv64_modinfo *)(ulong)uVar37;
      uVar61 = (uint)uVar31 ^ uVar37;
      uVar31 = (ulong)uVar61;
      psVar52 = (secp256k1_modinv64_modinfo *)(ulong)(uVar61 - 0x25b);
      if (uVar61 - 0x25b < 0xfffffb4d) goto LAB_00153cc9;
      uVar31 = (ulong)(uVar61 - 1);
      uVar51 = uVar51 + ((uStack_3ac ^ uVar12) - uStack_3ac & uVar55);
      uVar12 = (uVar12 + (uVar51 & uVar37)) * 2;
      uVar14 = uVar14 + ((uStack_3ac ^ uVar25) - uStack_3ac & uVar55);
      uVar18 = (uVar25 + (uVar14 & uVar37)) * 2;
      psVar39 = (secp256k1_modinv64_modinfo *)(ulong)uVar18;
      uVar55 = ((uStack_3ac ^ uVar45) - uStack_3ac & uVar55) + uVar43;
      uVar43 = uVar55 >> 1;
      uVar55 = uVar55 & uVar37;
      pcVar56 = (code *)(ulong)uVar55;
      uVar45 = uVar45 + uVar55;
      uVar55 = (int)uVar33 + 1;
      uVar33 = (ulong)uVar55;
    } while (uVar55 != 0x1e);
    psVar38 = (secp256k1_modinv64_modinfo *)(long)(int)uVar18;
    psVar52 = (secp256k1_modinv64_modinfo *)(long)(int)uVar12;
    psVar63 = (secp256k1_modinv64_modinfo *)(long)(int)uVar14;
    uVar33 = (long)psVar38 * (long)(int)uVar51 - (long)psVar52 * (long)psVar63;
    sStack_3a8.u = uVar18;
    sStack_3a8.v = uVar12;
    sStack_3a8.q = uVar14;
    sStack_3a8.r = uVar51;
    if (uVar33 != 0x40000000) {
LAB_00153cce:
      psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153cd3;
      secp256k1_modinv32_cold_3();
LAB_00153cd3:
      psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153cd8;
      secp256k1_modinv32_cold_15();
LAB_00153cd8:
      psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153cdd;
      secp256k1_modinv32_cold_14();
LAB_00153cdd:
      psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153ce2;
      secp256k1_modinv32_cold_13();
LAB_00153ce2:
      psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153ce7;
      secp256k1_modinv32_cold_12();
LAB_00153ce7:
      psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153cec;
      secp256k1_modinv32_cold_4();
LAB_00153cec:
      pcVar56 = (code *)psVar52;
      uVar12 = (uint)uVar33;
      psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153cf1;
      secp256k1_modinv32_cold_5();
LAB_00153cf1:
      psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153cf6;
      secp256k1_modinv32_cold_11();
LAB_00153cf6:
      psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153cfb;
      secp256k1_modinv32_cold_10();
LAB_00153cfb:
      psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153d00;
      secp256k1_modinv32_cold_9();
LAB_00153d00:
      psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153d05;
      secp256k1_modinv32_cold_8();
      goto LAB_00153d05;
    }
    psStack_3d0 = (secp256k1_modinv64_modinfo *)0x1539f3;
    lStack_368 = (long)(int)uVar51;
    secp256k1_modinv32_update_de_30
              ((secp256k1_modinv32_signed30 *)auStack_328,
               (secp256k1_modinv32_signed30 *)(auStack_328 + 0x24),&sStack_3a8,
               (secp256k1_modinv32_modinfo *)psStack_3c0);
    psVar28 = &sStack_398;
    uVar51 = 9;
    uVar33 = 0xffffffff;
    psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153a0f;
    psVar39 = psVar28;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar28,9,
                        (secp256k1_modinv32_signed30 *)psStack_3c0,-1);
    if (iVar13 < 1) goto LAB_00153cd3;
    uVar51 = 9;
    uVar33 = 1;
    psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153a2e;
    psVar39 = psVar28;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar28,9,
                        (secp256k1_modinv32_signed30 *)psStack_3c0,1);
    if (0 < iVar13) goto LAB_00153cd8;
    psVar28 = &sStack_358;
    uVar51 = 9;
    uVar33 = 0xffffffff;
    psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153a52;
    psVar39 = psVar28;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar28,9,
                        (secp256k1_modinv32_signed30 *)psStack_3c0,-1);
    if (iVar13 < 1) goto LAB_00153cdd;
    uVar51 = 9;
    uVar33 = 1;
    psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153a71;
    psVar39 = psVar28;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar28,9,
                        (secp256k1_modinv32_signed30 *)psStack_3c0,1);
    pcVar56 = (code *)psStack_3c0;
    if (-1 < iVar13) goto LAB_00153ce2;
    psVar28 = (secp256k1_modinv64_modinfo *)((long)psVar52 * uVar47 + (long)psVar38 * uStack_360);
    uVar33 = uStack_360;
    if (((ulong)psVar28 & 0x3ffffffe) != 0) goto LAB_00153ce7;
    uVar33 = uStack_360 * (long)psVar63;
    uVar47 = uVar47 * lStack_368 + uVar33;
    if ((uVar47 & 0x3fffffff) != 0) goto LAB_00153cec;
    uVar47 = (long)uVar47 >> 0x1e;
    psVar28 = (secp256k1_modinv64_modinfo *)((long)psVar28 >> 0x1e);
    lVar53 = 1;
    do {
      lVar21 = (long)*(int *)((long)sStack_398.modulus.v + lVar53 * 4);
      lVar22 = (long)*(int *)((long)sStack_358.modulus.v + lVar53 * 4);
      lVar24 = (long)(psVar28->modulus).v + lVar22 * (long)psVar52 + lVar21 * (long)psVar38;
      lVar21 = lVar22 * lStack_368 + lVar21 * (long)psVar63 + uVar47;
      *(uint *)((long)sStack_398.modulus.v + lVar53 * 4 + -4) = (uint)lVar24 & 0x3fffffff;
      *(uint *)((long)&uStack_360 + lVar53 * 4 + 4) = (uint)lVar21 & 0x3fffffff;
      lVar53 = lVar53 + 1;
      uVar47 = lVar21 >> 0x1e;
      psVar28 = (secp256k1_modinv64_modinfo *)(lVar24 >> 0x1e);
    } while (lVar53 != 9);
    sStack_358.modulus.v[4]._0_4_ = (undefined4)uVar47;
    psVar38 = &sStack_398;
    uVar51 = 9;
    uVar12 = 0xffffffff;
    psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153b43;
    psVar39 = psVar38;
    sStack_398.modulus.v[4]._0_4_ = (int32_t)psVar28;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar38,9,
                        (secp256k1_modinv32_signed30 *)psStack_3c0,-1);
    if (iVar13 < 1) goto LAB_00153cf1;
    uVar51 = 9;
    uVar12 = 1;
    psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153b60;
    psVar39 = psVar38;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar38,9,
                        (secp256k1_modinv32_signed30 *)pcVar56,1);
    if (0 < iVar13) goto LAB_00153cf6;
    psVar38 = &sStack_358;
    uVar51 = 9;
    uVar12 = 0xffffffff;
    psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153b82;
    psVar39 = psVar38;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar38,9,
                        (secp256k1_modinv32_signed30 *)pcVar56,-1);
    if (iVar13 < 1) goto LAB_00153cfb;
    uVar51 = 9;
    uVar12 = 1;
    psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153b9f;
    psVar39 = psVar38;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar38,9,
                        (secp256k1_modinv32_signed30 *)pcVar56,1);
    if (-1 < iVar13) goto LAB_00153d00;
    iVar13 = iStack_3b4 + 1;
  } while (iVar13 != 0x14);
  psVar39 = &sStack_358;
  uVar51 = 9;
  uVar12 = 0;
  psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153bce;
  iVar13 = secp256k1_modinv32_mul_cmp_30
                     ((secp256k1_modinv32_signed30 *)psVar39,9,&SECP256K1_SIGNED30_ONE,0);
  if (iVar13 == 0) {
    psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153bf1;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_398,9,&SECP256K1_SIGNED30_ONE,-1);
    psVar38 = (secp256k1_modinv64_modinfo *)sStack_398.modulus_inv62;
    if (iVar13 == 0) {
LAB_00153c79:
      psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153c8e;
      secp256k1_modinv32_normalize_30
                ((secp256k1_modinv32_signed30 *)auStack_328,(int32_t)psVar28,
                 (secp256k1_modinv32_modinfo *)pcVar56);
      *(undefined4 *)((psVar38->modulus).v + 4) = auStack_328._32_4_;
      (psVar38->modulus).v[2] = auStack_328._16_8_;
      (psVar38->modulus).v[3] = auStack_328._24_8_;
      (psVar38->modulus).v[0] = auStack_328._0_8_;
      (psVar38->modulus).v[1] = auStack_328._8_8_;
      return;
    }
    psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153c15;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)&sStack_398,9,&SECP256K1_SIGNED30_ONE,1);
    if (iVar13 == 0) goto LAB_00153c79;
    uVar51 = 9;
    uVar12 = 0;
    psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153c2f;
    psVar39 = psVar38;
    iVar13 = secp256k1_modinv32_mul_cmp_30
                       ((secp256k1_modinv32_signed30 *)psVar38,9,&SECP256K1_SIGNED30_ONE,0);
    if (iVar13 == 0) {
      psVar39 = (secp256k1_modinv64_modinfo *)auStack_328;
      uVar51 = 9;
      uVar12 = 0;
      psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153c52;
      iVar13 = secp256k1_modinv32_mul_cmp_30
                         ((secp256k1_modinv32_signed30 *)psVar39,9,&SECP256K1_SIGNED30_ONE,0);
      if (iVar13 == 0) {
        psVar39 = &sStack_398;
        uVar51 = 9;
        uVar12 = 1;
        psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153c71;
        iVar13 = secp256k1_modinv32_mul_cmp_30
                           ((secp256k1_modinv32_signed30 *)psVar39,9,
                            (secp256k1_modinv32_signed30 *)pcVar56,1);
        if (iVar13 == 0) goto LAB_00153c79;
      }
    }
  }
  else {
LAB_00153d05:
    psStack_3d0 = (secp256k1_modinv64_modinfo *)0x153d0a;
    secp256k1_modinv32_cold_6();
  }
  psStack_3d0 = (secp256k1_modinv64_modinfo *)secp256k1_modinv32_mul_cmp_30;
  secp256k1_modinv32_cold_7();
  a_01 = &sStack_420;
  piVar29 = (int *)(ulong)uVar12;
  pcStack_428 = (code *)0x153d2f;
  psStack_3d8 = psVar28;
  psStack_3d0 = psVar38;
  secp256k1_modinv32_mul_30(&sStack_3fc,(secp256k1_modinv32_signed30 *)psVar39,uVar51,1);
  pcStack_428 = (code *)0x153d41;
  piVar49 = piVar29;
  psVar34 = a_00;
  secp256k1_modinv32_mul_30(&sStack_420,a_00,9,uVar12);
  lVar53 = 0;
  while ((uint)sStack_3fc.v[lVar53] < 0x40000000) {
    if (0x3fffffff < (uint)sStack_420.v[lVar53]) goto LAB_00153d93;
    lVar53 = lVar53 + 1;
    if (lVar53 == 8) {
      uVar12 = 8;
      while( true ) {
        if (sStack_3fc.v[uVar12] < sStack_420.v[uVar12]) {
          return;
        }
        if (sStack_420.v[uVar12] < sStack_3fc.v[uVar12]) break;
        bVar65 = uVar12 == 0;
        uVar12 = uVar12 - 1;
        if (bVar65) {
          return;
        }
      }
      return;
    }
  }
  pcStack_428 = (code *)0x153d93;
  secp256k1_modinv32_mul_cmp_30_cold_2();
LAB_00153d93:
  pcStack_428 = secp256k1_modinv32_update_fg_30_var;
  secp256k1_modinv32_mul_cmp_30_cold_1();
  iVar13 = (int)a_01;
  piStack_450 = piVar29;
  uStack_448 = uVar31;
  psStack_440 = (secp256k1_modinv64_modinfo *)pcVar56;
  psStack_430 = psVar63;
  pcStack_428 = (code *)uVar47;
  if (iVar13 < 1) {
    psStack_460 = (secp256k1_modinv32_signed30 *)0x153e86;
    secp256k1_modinv32_update_fg_30_var_cold_3();
LAB_00153e86:
    iVar20 = (int)piVar49;
    psStack_460 = (secp256k1_modinv32_signed30 *)0x153e8b;
    secp256k1_modinv32_update_fg_30_var_cold_1();
  }
  else {
    iVar19 = piVar49[1];
    iVar4 = *piVar49;
    piVar29 = (int *)(long)psVar34->v[0];
    uVar33 = (long)*extraout_RDX * (long)iVar19 + (long)piVar29 * (long)iVar4;
    if ((uVar33 & 0x3fffffff) != 0) goto LAB_00153e86;
    iVar5 = piVar49[3];
    iVar20 = piVar49[2];
    piVar29 = (int *)((long)piVar29 * (long)iVar20);
    piVar49 = (int *)((long)*extraout_RDX * (long)iVar5 + (long)piVar29);
    if (((ulong)piVar49 & 0x3fffffff) == 0) {
      lVar21 = (long)piVar49 >> 0x1e;
      lVar53 = (long)uVar33 >> 0x1e;
      if (iVar13 != 1) {
        uVar31 = 1;
        do {
          lVar53 = (long)extraout_RDX[uVar31] * (long)iVar19 +
                   (long)psVar34->v[uVar31] * (long)iVar4 + lVar53;
          lVar21 = (long)extraout_RDX[uVar31] * (long)iVar5 +
                   (long)psVar34->v[uVar31] * (long)iVar20 + lVar21;
          psVar34->v[uVar31 - 1] = (uint)lVar53 & 0x3fffffff;
          extraout_RDX[uVar31 - 1] = (uint)lVar21 & 0x3fffffff;
          uVar31 = uVar31 + 1;
          lVar21 = lVar21 >> 0x1e;
          lVar53 = lVar53 >> 0x1e;
        } while (((ulong)a_01 & 0xffffffff) != uVar31);
      }
      psVar34->v[(long)iVar13 + -1] = (int32_t)lVar53;
      extraout_RDX[(long)iVar13 + -1] = (int)lVar21;
      return;
    }
  }
  psStack_460 = (secp256k1_modinv32_signed30 *)secp256k1_modinv32_mul_30;
  secp256k1_modinv32_update_fg_30_var_cold_2();
  lVar53 = 0;
  psStack_460 = (secp256k1_modinv32_signed30 *)0x0;
  do {
    if (lVar53 < extraout_EDX) {
      psStack_460 = (secp256k1_modinv32_signed30 *)
                    ((long)psStack_460->v + (long)psVar34->v[lVar53] * (long)iVar20);
    }
    a_01->v[lVar53] = (uint)psStack_460 & 0x3fffffff;
    psStack_460 = (secp256k1_modinv32_signed30 *)((long)psStack_460 >> 0x1e);
    lVar53 = lVar53 + 1;
  } while (lVar53 != 8);
  if (8 < extraout_EDX) {
    psStack_460 = (secp256k1_modinv32_signed30 *)
                  ((long)psStack_460->v + (long)psVar34->v[8] * (long)iVar20);
  }
  b = (secp256k1_modinv32_signed30 *)(long)(int)psStack_460;
  if (b == psStack_460) {
    a_01->v[8] = (int)psStack_460;
    return;
  }
  pcStack_468 = secp256k1_modinv32_update_de_30;
  secp256k1_modinv32_mul_30_cold_1();
  uVar12 = *extraout_RDX_00;
  psVar58 = (secp256k1_modinv32_signed30 *)(long)(int)uVar12;
  uVar43 = extraout_RDX_00[1];
  lVar53 = (long)(int)uVar43;
  uVar45 = extraout_RDX_00[2];
  psVar30 = (secp256k1_modinv32_signed30 *)(long)(int)uVar45;
  lStack_4a0 = (long)(int)extraout_RDX_00[3];
  psVar35 = (secp256k1_fe *)0x9;
  pcStack_4b0 = (code *)0x153f25;
  a_02 = a_01;
  piStack_490 = piVar29;
  uStack_488 = uVar31;
  psStack_480 = (secp256k1_modinv64_modinfo *)pcVar56;
  psStack_470 = psVar63;
  pcStack_468 = (code *)uVar47;
  iVar13 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
  if (iVar13 < 1) {
    pcStack_4b0 = (code *)0x15418d;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_0015418d:
    pcStack_4b0 = (code *)0x154192;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_00154192:
    pcStack_4b0 = (code *)0x154197;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_00154197:
    pcStack_4b0 = (code *)0x15419c;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_0015419c:
    pcStack_4b0 = (code *)0x1541a1;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_001541a1:
    pcStack_4b0 = (code *)0x1541a6;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_001541a6:
    pcStack_4b0 = (code *)0x1541ab;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_001541ab:
    pcStack_4b0 = (code *)0x1541b0;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar54 = b;
LAB_001541b0:
    pcStack_4b0 = (code *)0x1541b5;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_001541b5:
    pcStack_4b0 = (code *)0x1541ba;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_001541ba:
    pcStack_4b0 = (code *)0x1541bf;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    psVar35 = (secp256k1_fe *)0x9;
    pcStack_4b0 = (code *)0x153f42;
    a_02 = a_01;
    iVar13 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,1);
    if (-1 < iVar13) goto LAB_0015418d;
    psVar35 = (secp256k1_fe *)0x9;
    pcStack_4b0 = (code *)0x153f5f;
    a_02 = psVar34;
    iVar13 = secp256k1_modinv32_mul_cmp_30(psVar34,9,b,-2);
    if (iVar13 < 1) goto LAB_00154192;
    psVar35 = (secp256k1_fe *)0x9;
    pcStack_4b0 = (code *)0x153f7c;
    a_02 = psVar34;
    iVar13 = secp256k1_modinv32_mul_cmp_30(psVar34,9,b,1);
    if (-1 < iVar13) goto LAB_00154197;
    psVar54 = (secp256k1_modinv32_signed30 *)-(long)psVar58;
    if (0 < (long)psVar58) {
      psVar54 = psVar58;
    }
    lVar21 = -lVar53;
    if (lVar53 < 1) {
      lVar21 = lVar53;
    }
    if (lVar21 + 0x40000000 < (long)psVar54) goto LAB_0015419c;
    psVar54 = (secp256k1_modinv32_signed30 *)-(long)psVar30;
    if (0 < (long)psVar30) {
      psVar54 = psVar30;
    }
    lVar21 = -lStack_4a0;
    if (lStack_4a0 < 1) {
      lVar21 = lStack_4a0;
    }
    if (lVar21 + 0x40000000 < (long)psVar54) goto LAB_001541a1;
    uVar51 = a_01->v[8] >> 0x1f;
    uVar14 = psVar34->v[8] >> 0x1f;
    psVar35 = (secp256k1_fe *)(ulong)uVar14;
    iVar13 = (uVar14 & uVar43) + (uVar51 & uVar12);
    a_02 = (secp256k1_modinv32_signed30 *)
           (psVar34->v[0] * lVar53 + (long)a_01->v[0] * (long)psVar58);
    lVar21 = (long)(int)(iVar13 - ((int)a_02 * b[1].v[0] + iVar13 & 0x3fffffffU));
    piVar23 = (int32_t *)((long)a_02->v + lVar21 * b->v[0]);
    if (((ulong)piVar23 & 0x3fffffff) != 0) goto LAB_001541a6;
    lStack_498 = lVar21;
    iVar13 = (uVar14 & (uint)lStack_4a0) + (uVar51 & uVar45);
    lVar22 = psVar34->v[0] * lStack_4a0 + (long)a_01->v[0] * (long)psVar30;
    a_02 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar12 = iVar13 - (b[1].v[0] * (int)lVar22 + iVar13 & 0x3fffffffU);
    psVar35 = (secp256k1_fe *)(ulong)uVar12;
    uVar31 = (long)b->v[0] * (long)(int)uVar12 + lVar22;
    if ((uVar31 & 0x3fffffff) != 0) goto LAB_001541ab;
    lVar22 = (long)uVar31 >> 0x1e;
    lVar24 = (long)piVar23 >> 0x1e;
    lVar40 = 1;
    do {
      lVar24 = b->v[lVar40] * lVar21 + psVar34->v[lVar40] * lVar53 +
               (long)a_01->v[lVar40] * (long)psVar58 + lVar24;
      psVar54 = (secp256k1_modinv32_signed30 *)(psVar34->v[lVar40] * lStack_4a0);
      lVar22 = (long)psVar54->v +
               (long)a_01->v[lVar40] * (long)psVar30 + lVar22 +
               (long)b->v[lVar40] * (long)(int)uVar12;
      a_01->v[lVar40 + -1] = (uint)lVar24 & 0x3fffffff;
      psVar34->v[lVar40 + -1] = (uint)lVar22 & 0x3fffffff;
      lVar40 = lVar40 + 1;
      lVar22 = lVar22 >> 0x1e;
      lVar24 = lVar24 >> 0x1e;
    } while (lVar40 != 9);
    a_01->v[8] = (int32_t)lVar24;
    psVar34->v[8] = (int32_t)lVar22;
    psVar35 = (secp256k1_fe *)0x9;
    pcStack_4b0 = (code *)0x154126;
    a_02 = a_01;
    iVar13 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,-2);
    psVar30 = psVar34;
    psVar58 = b;
    if (iVar13 < 1) goto LAB_001541b0;
    psVar35 = (secp256k1_fe *)0x9;
    pcStack_4b0 = (code *)0x154143;
    a_02 = a_01;
    iVar13 = secp256k1_modinv32_mul_cmp_30(a_01,9,b,1);
    if (-1 < iVar13) goto LAB_001541b5;
    psVar35 = (secp256k1_fe *)0x9;
    pcStack_4b0 = (code *)0x15415c;
    a_02 = psVar34;
    iVar13 = secp256k1_modinv32_mul_cmp_30(psVar34,9,b,-2);
    if (iVar13 < 1) goto LAB_001541ba;
    psVar35 = (secp256k1_fe *)0x9;
    pcStack_4b0 = (code *)0x154175;
    a_02 = psVar34;
    iVar13 = secp256k1_modinv32_mul_cmp_30(psVar34,9,b,1);
    if (iVar13 < 0) {
      return;
    }
  }
  pcStack_4b0 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  pcStack_4b0 = (code *)lVar53;
  psStack_4b8 = a_01;
  psStack_4c0 = psVar34;
  psStack_4c8 = psVar58;
  psStack_4d0 = psVar54;
  psStack_4d8 = psVar30;
  uVar12 = a_02->v[0];
  uVar36 = (ulong)uVar12;
  uVar43 = a_02->v[3];
  uVar48 = (ulong)uVar43;
  uVar45 = a_02->v[4];
  uVar33 = (ulong)uVar45;
  uVar14 = a_02->v[5];
  uVar47 = (ulong)uVar14;
  psVar34 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_02->v[6];
  uVar51 = a_02->v[7];
  uVar31 = (ulong)uVar51;
  iStack_4dc = a_02->v[8];
  lVar53 = 0;
  do {
    if (a_02->v[lVar53] < -0x3fffffff) {
      pcStack_518 = (code *)0x15450d;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_0015450d:
      pcStack_518 = (code *)0x154512;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_00154512;
    }
    if (0x3fffffff < a_02->v[lVar53]) goto LAB_0015450d;
    lVar53 = lVar53 + 1;
  } while (lVar53 != 9);
  uStack_4fc = (uint)psVar35;
  psVar35 = (secp256k1_fe *)0x9;
  pcStack_518 = (code *)0x15424a;
  psVar34 = a_02;
  uStack_508 = a_02->v[1];
  uStack_504 = a_02->v[2];
  uStack_500 = a_02->v[6];
  psStack_4f8 = b_00;
  iVar13 = secp256k1_modinv32_mul_cmp_30(a_02,9,b_00,-2);
  if (iVar13 < 1) {
LAB_00154512:
    pcStack_518 = (code *)0x154517;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_00154517:
    pcStack_518 = (code *)0x15451c;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_0015451c:
    pcStack_518 = (code *)0x154521;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_00154521:
    pcStack_518 = (code *)0x154526;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar35 = (secp256k1_fe *)0x9;
    pcStack_518 = (code *)0x154269;
    psVar34 = a_02;
    iVar13 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_4f8,1);
    if (-1 < iVar13) goto LAB_00154517;
    uVar18 = iStack_4dc >> 0x1f;
    uStack_4e0 = psStack_4f8->v[1];
    uVar55 = (uVar18 & uStack_4e0) + uStack_508;
    uStack_508 = psStack_4f8->v[2];
    uVar25 = (uVar18 & uStack_508) + uStack_504;
    uStack_504 = psStack_4f8->v[3];
    uStack_4e4 = psStack_4f8->v[4];
    uStack_4e8 = psStack_4f8->v[5];
    uStack_4ec = psStack_4f8->v[6];
    uVar26 = (uVar18 & uStack_4ec) + uStack_500;
    uStack_500 = psStack_4f8->v[7];
    uStack_50c = (int)uStack_4fc >> 0x1f;
    uStack_4fc = psStack_4f8->v[8];
    uVar61 = ((uVar18 & psStack_4f8->v[0]) + uVar12 ^ uStack_50c) - uStack_50c;
    uVar37 = ((int)uVar61 >> 0x1e) + ((uVar55 ^ uStack_50c) - uStack_50c);
    uVar55 = ((int)uVar37 >> 0x1e) + ((uVar25 ^ uStack_50c) - uStack_50c);
    uVar62 = ((int)uVar55 >> 0x1e) + (((uVar18 & uStack_504) + uVar43 ^ uStack_50c) - uStack_50c);
    uVar43 = ((int)uVar62 >> 0x1e) + (((uVar18 & uStack_4e4) + uVar45 ^ uStack_50c) - uStack_50c);
    uVar12 = ((int)uVar43 >> 0x1e) + (((uVar18 & uStack_4e8) + uVar14 ^ uStack_50c) - uStack_50c);
    uVar45 = ((int)uVar12 >> 0x1e) + ((uVar26 ^ uStack_50c) - uStack_50c);
    uVar14 = ((int)uVar45 >> 0x1e) + (((uVar18 & uStack_500) + uVar51 ^ uStack_50c) - uStack_50c);
    uVar59 = ((int)uVar14 >> 0x1e) +
             (((uVar18 & uStack_4fc) + iStack_4dc ^ uStack_50c) - uStack_50c);
    uVar47 = (ulong)uVar59;
    uStack_510 = (int)uVar59 >> 0x1f;
    uVar26 = (psStack_4f8->v[0] & uStack_510) + (uVar61 & 0x3fffffff);
    uVar25 = (uStack_4e8 & uStack_510) + (uVar12 & 0x3fffffff);
    uVar36 = (ulong)uVar25;
    uVar61 = (uStack_4ec & uStack_510) + (uVar45 & 0x3fffffff);
    uVar48 = (ulong)uVar61;
    uVar12 = ((int)uVar26 >> 0x1e) + (uStack_4e0 & uStack_510) + (uVar37 & 0x3fffffff);
    uVar45 = ((int)uVar12 >> 0x1e) + (uStack_508 & uStack_510) + (uVar55 & 0x3fffffff);
    uVar51 = ((int)uVar45 >> 0x1e) + (uStack_504 & uStack_510) + (uVar62 & 0x3fffffff);
    uVar18 = ((int)uVar51 >> 0x1e) + (uStack_4e4 & uStack_510) + (uVar43 & 0x3fffffff);
    uVar25 = ((int)uVar18 >> 0x1e) + uVar25;
    uVar61 = ((int)uVar25 >> 0x1e) + uVar61;
    uVar43 = ((int)uVar61 >> 0x1e) + (uStack_500 & uStack_510) + (uVar14 & 0x3fffffff);
    uVar14 = ((int)uVar43 >> 0x1e) + (uStack_4fc & uStack_510) + uVar59;
    uVar33 = (ulong)uVar14;
    uVar51 = uVar51 & 0x3fffffff;
    psVar35 = (secp256k1_fe *)(ulong)uVar51;
    uVar18 = uVar18 & 0x3fffffff;
    psVar34 = (secp256k1_modinv32_signed30 *)(ulong)uVar18;
    uVar43 = uVar43 & 0x3fffffff;
    uVar31 = (ulong)uVar43;
    a_02->v[0] = uVar26 & 0x3fffffff;
    a_02->v[1] = uVar12 & 0x3fffffff;
    a_02->v[2] = uVar45 & 0x3fffffff;
    a_02->v[3] = uVar51;
    a_02->v[4] = uVar18;
    a_02->v[5] = uVar25 & 0x3fffffff;
    a_02->v[6] = uVar61 & 0x3fffffff;
    a_02->v[7] = uVar43;
    a_02->v[8] = uVar14;
    if (0x3fffffff < uVar14) goto LAB_0015451c;
    psVar35 = (secp256k1_fe *)0x9;
    pcStack_518 = (code *)0x1544da;
    psVar34 = a_02;
    iVar13 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_4f8,0);
    if (iVar13 < 0) goto LAB_00154521;
    psVar35 = (secp256k1_fe *)0x9;
    pcStack_518 = (code *)0x1544f5;
    psVar34 = a_02;
    iVar13 = secp256k1_modinv32_mul_cmp_30(a_02,9,psStack_4f8,1);
    if (iVar13 < 0) {
      return;
    }
  }
  pcStack_518 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  psStack_5b0 = (secp256k1_fe *)secp256k1_fe_inv_var;
  if (extraout_EDX_00 == 0) {
    psStack_5b0 = (secp256k1_fe *)secp256k1_fe_inv;
  }
  pcStack_600 = (code *)0x154562;
  uStack_540 = uVar31;
  uStack_538 = uVar47;
  uStack_530 = uVar48;
  psStack_528 = a_02;
  uStack_520 = uVar36;
  pcStack_518 = (code *)uVar33;
  (*(code *)psStack_5b0)(&sStack_5e8);
  if (psVar34 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar34->v + 8) = sStack_5e8.n[4];
    *(ulong *)(psVar34[1].v + 1) = CONCAT44(sStack_5e8.normalized,sStack_5e8.magnitude);
    *(uint64_t *)(psVar34->v + 4) = sStack_5e8.n[2];
    *(uint64_t *)(psVar34->v + 6) = sStack_5e8.n[3];
    *(uint64_t *)psVar34->v = sStack_5e8.n[0];
    *(uint64_t *)(psVar34->v + 2) = sStack_5e8.n[1];
  }
  uVar64 = 0xfffffffffffff;
  uVar16 = 0xf000000000000;
  uVar33 = 0xffffffffffff;
  uVar47 = 0x1000003d0;
  sStack_578.n[0] = psVar35->n[0];
  sStack_578.n[1] = psVar35->n[1];
  sStack_578.n[2] = psVar35->n[2];
  sStack_578.n[3] = psVar35->n[3];
  sStack_578.n[4] = psVar35->n[4];
  sStack_578.magnitude = psVar35->magnitude;
  sStack_578.normalized = psVar35->normalized;
  a_03 = &sStack_578;
  pcStack_600 = (code *)0x1545d9;
  secp256k1_fe_verify(a_03);
  lStack_5f0 = 0x1000003d1;
  uVar31 = (sStack_578.n[4] >> 0x30) * 0x1000003d1 + sStack_578.n[0];
  if (((uVar31 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar31 & 0xfffffffffffff) == 0)) {
    uVar48 = (uVar31 >> 0x34) + sStack_578.n[1];
    uVar36 = (uVar48 >> 0x34) + sStack_578.n[2];
    uVar41 = (uVar36 >> 0x34) + sStack_578.n[3];
    uVar44 = (uVar41 >> 0x34) + (sStack_578.n[4] & 0xffffffffffff);
    if ((((uVar48 | uVar31 | uVar36 | uVar41) & 0xfffffffffffff) != 0 || uVar44 != 0) &&
       (((uVar31 | 0x1000003d0) & uVar48 & uVar36 & uVar41 & (uVar44 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0015467c;
LAB_00154a90:
    psVar35 = &sStack_5e8;
    pcStack_600 = (code *)0x154a9d;
    secp256k1_fe_verify(psVar35);
    uVar33 = uVar33 & sStack_5e8.n[4];
    uVar31 = (sStack_5e8.n[4] >> 0x30) * lStack_5f0 + sStack_5e8.n[0];
    uVar48 = (uVar31 >> 0x34) + sStack_5e8.n[1];
    uVar36 = (uVar48 >> 0x34) + sStack_5e8.n[2];
    r = (secp256k1_fe *)((uVar36 >> 0x34) + sStack_5e8.n[3]);
    uVar41 = ((ulong)r >> 0x34) + uVar33;
    if ((((uVar48 | uVar31 | uVar36 | (ulong)r) & uVar64) == 0 && uVar41 == 0) ||
       (r_00 = (secp256k1_fe *)(uVar41 ^ uVar16),
       ((uVar31 ^ uVar47) & uVar48 & uVar36 & (ulong)r & (ulong)r_00) == uVar64)) {
      return;
    }
  }
  else {
LAB_0015467c:
    pcStack_600 = (code *)0x154694;
    r = psVar35;
    secp256k1_fe_mul(&sStack_578,psVar35,&sStack_5e8);
    pcStack_600 = (code *)0x15469c;
    secp256k1_fe_verify(&sStack_578);
    r_00 = &fe_minus_one;
    pcStack_600 = (code *)0x1546a8;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_578.magnitude < 0x20) {
      sStack_578.n[0] = sStack_578.n[0] + 0xffffefffffc2e;
      sStack_578.n[1] = sStack_578.n[1] + 0xfffffffffffff;
      sStack_578.n[2] = sStack_578.n[2] + 0xfffffffffffff;
      sStack_578.n[3] = sStack_578.n[3] + 0xfffffffffffff;
      sStack_578.n[4] = sStack_578.n[4] + 0xffffffffffff;
      sStack_578.normalized = 0;
      sStack_578.magnitude = sStack_578.magnitude + 1;
      pcStack_600 = (code *)0x1546fd;
      secp256k1_fe_verify(&sStack_578);
      pcStack_600 = (code *)0x154705;
      secp256k1_fe_verify(&sStack_578);
      uVar31 = (sStack_578.n[4] >> 0x30) * lStack_5f0 + sStack_578.n[0];
      uVar33 = (uVar31 >> 0x34) + sStack_578.n[1];
      uVar48 = (uVar33 >> 0x34) + sStack_578.n[2];
      r = (secp256k1_fe *)((uVar48 >> 0x34) + sStack_578.n[3]);
      uVar36 = ((ulong)r >> 0x34) + (sStack_578.n[4] & 0xffffffffffff);
      if ((((uVar33 | uVar31 | uVar48 | (ulong)r) & 0xfffffffffffff) != 0 || uVar36 != 0) &&
         (r_00 = (secp256k1_fe *)(uVar36 ^ 0xf000000000000),
         ((uVar31 ^ 0x1000003d0) & uVar33 & uVar48 & (ulong)r & (ulong)r_00) != 0xfffffffffffff))
      goto LAB_00154b1e;
      sStack_5a8.n[0] = psVar35->n[0];
      sStack_5a8.n[1] = psVar35->n[1];
      sStack_5a8.n[2] = psVar35->n[2];
      sStack_5a8.n[3] = psVar35->n[3];
      sStack_5a8.n[4] = psVar35->n[4];
      sStack_5a8.magnitude = psVar35->magnitude;
      sStack_5a8.normalized = psVar35->normalized;
      psVar35 = &sStack_5a8;
      pcStack_600 = (code *)0x15479d;
      secp256k1_fe_verify(psVar35);
      r_00 = &fe_minus_one;
      pcStack_600 = (code *)0x1547a9;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_5a8.magnitude) goto LAB_00154b23;
      uVar32 = sStack_5a8.n[0] + 0xffffefffffc2e;
      uVar60 = sStack_5a8.n[1] + 0xfffffffffffff;
      uVar64 = sStack_5a8.n[2] + 0xfffffffffffff;
      uVar16 = sStack_5a8.n[3] + 0xfffffffffffff;
      uVar47 = sStack_5a8.n[4] + 0xffffffffffff;
      sStack_5a8.normalized = 0;
      sStack_5a8.magnitude = sStack_5a8.magnitude + 1;
      pcStack_600 = (code *)0x15481e;
      sStack_5a8.n[0] = uVar32;
      sStack_5a8.n[1] = uVar60;
      sStack_5a8.n[2] = uVar64;
      sStack_5a8.n[3] = uVar16;
      sStack_5a8.n[4] = uVar47;
      secp256k1_fe_verify(&sStack_5a8);
      pcStack_600 = (code *)0x154826;
      secp256k1_fe_verify(&sStack_5a8);
      a_03 = psStack_5b0;
      uVar31 = (uVar47 >> 0x30) * lStack_5f0 + uVar32;
      if (((uVar31 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar31 & 0xfffffffffffff) == 0)) {
        uVar47 = uVar47 & 0xffffffffffff;
        uVar41 = uVar60 + (uVar31 >> 0x34);
        uVar33 = (uVar41 >> 0x34) + uVar64;
        uVar48 = (uVar33 >> 0x34) + uVar16;
        uVar36 = (uVar48 >> 0x34) + uVar47;
        if (((uVar41 | uVar31 | uVar33 | uVar48) & 0xfffffffffffff) == 0 && uVar36 == 0) {
          return;
        }
        if (((uVar31 | 0x1000003d0) & uVar41 & uVar33 & uVar48 & (uVar36 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      r = &sStack_5a8;
      pcStack_600 = (code *)0x1548e6;
      (*(code *)psStack_5b0)();
      psVar35 = &sStack_5e8;
      pcStack_600 = (code *)0x1548f3;
      secp256k1_fe_verify(psVar35);
      r_00 = &fe_minus_one;
      pcStack_600 = (code *)0x1548ff;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_5e8.magnitude) goto LAB_00154b28;
      psVar35 = &sStack_5e8;
      sStack_5e8.n[0] = sStack_5e8.n[0] + 0xffffefffffc2e;
      sStack_5e8.n[1] = sStack_5e8.n[1] + 0xfffffffffffff;
      sStack_5e8.n[2] = sStack_5e8.n[2] + 0xfffffffffffff;
      sStack_5e8.n[3] = sStack_5e8.n[3] + 0xfffffffffffff;
      sStack_5e8.n[4] = sStack_5e8.n[4] + 0xffffffffffff;
      sStack_5e8.magnitude = sStack_5e8.magnitude + 1;
      uVar33 = 0;
      sStack_5e8.normalized = 0;
      pcStack_600 = (code *)0x154948;
      secp256k1_fe_verify(psVar35);
      pcStack_600 = (code *)0x154951;
      r = psVar35;
      (*(code *)a_03)(psVar35);
      pcStack_600 = (code *)0x154959;
      secp256k1_fe_verify(psVar35);
      sStack_5e8.n[0] = sStack_5e8.n[0] + 1;
      sStack_5e8.magnitude = sStack_5e8.magnitude + 1;
      sStack_5e8.normalized = 0;
      pcStack_600 = (code *)0x15496a;
      secp256k1_fe_verify(psVar35);
      pcStack_600 = (code *)0x154972;
      secp256k1_fe_verify(psVar35);
      a_03 = &sStack_5a8;
      pcStack_600 = (code *)0x15497f;
      r_00 = a_03;
      secp256k1_fe_verify(a_03);
      if (sStack_5a8.magnitude + sStack_5e8.magnitude < 0x21) {
        sStack_5e8.n[0] = sStack_5e8.n[0] + sStack_5a8.n[0];
        sStack_5e8.n[1] = sStack_5e8.n[1] + sStack_5a8.n[1];
        sStack_5e8.n[2] = sStack_5e8.n[2] + sStack_5a8.n[2];
        sStack_5e8.n[3] = sStack_5e8.n[3] + sStack_5a8.n[3];
        sStack_5e8.n[4] = sStack_5e8.n[4] + sStack_5a8.n[4];
        sStack_5e8.normalized = 0;
        pcStack_600 = (code *)0x1549cd;
        sStack_5e8.magnitude = sStack_5a8.magnitude + sStack_5e8.magnitude;
        secp256k1_fe_verify(&sStack_5e8);
        pcStack_600 = (code *)0x1549d5;
        secp256k1_fe_verify(&sStack_5e8);
        uVar31 = (sStack_5e8.n[4] >> 0x30) * lStack_5f0 + sStack_5e8.n[0];
        if (((uVar31 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar31 & 0xfffffffffffff) == 0)) {
          uVar48 = (uVar31 >> 0x34) + sStack_5e8.n[1];
          uVar36 = (uVar48 >> 0x34) + sStack_5e8.n[2];
          uVar41 = (uVar36 >> 0x34) + sStack_5e8.n[3];
          uVar44 = (uVar41 >> 0x34) + (sStack_5e8.n[4] & 0xffffffffffff);
          if (((uVar48 | uVar31 | uVar36 | uVar41) & 0xfffffffffffff) == 0 && uVar44 == 0) {
            return;
          }
          if (((uVar31 | 0x1000003d0) & uVar48 & uVar36 & uVar41 & (uVar44 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_600 = (code *)0x154a90;
        test_inverse_field_cold_2();
        goto LAB_00154a90;
      }
    }
    else {
      pcStack_600 = (code *)0x154b1e;
      test_inverse_field_cold_7();
LAB_00154b1e:
      pcStack_600 = (code *)0x154b23;
      test_inverse_field_cold_6();
LAB_00154b23:
      a_03 = &sStack_578;
      pcStack_600 = (code *)0x154b28;
      test_inverse_field_cold_5();
LAB_00154b28:
      uVar33 = 0xffffffffffff;
      pcStack_600 = (code *)0x154b2d;
      test_inverse_field_cold_4();
    }
    pcStack_600 = (code *)0x154b32;
    test_inverse_field_cold_3();
  }
  pcStack_600 = test_inverse_scalar;
  test_inverse_field_cold_1();
  psVar42 = (secp256k1_fe *)auStack_670;
  pcVar56 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_01 == 0) {
    pcVar56 = secp256k1_scalar_inverse;
  }
  pcStack_678 = (code *)0x154b60;
  auStack_630._32_8_ = psVar35;
  auStack_630._40_8_ = a_03;
  pcStack_600 = (code *)uVar64;
  (*pcVar56)(auStack_670);
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_670._20_4_,auStack_670._16_4_);
    r_00->n[3] = CONCAT44(auStack_670._28_4_,auStack_670._24_4_);
    r_00->n[0] = CONCAT44(auStack_670._4_4_,auStack_670._0_4_);
    r_00->n[1] = CONCAT44(auStack_670._12_4_,auStack_670._8_4_);
  }
  pcStack_678 = (code *)0x154b7f;
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  auVar66._0_4_ = -(uint)((int)r->n[2] == 0 && (int)r->n[0] == 0);
  auVar66._4_4_ = -(uint)(*(int *)((long)r->n + 0x14) == 0 && *(int *)((long)r->n + 4) == 0);
  auVar66._8_4_ = -(uint)((int)r->n[3] == 0 && (int)r->n[1] == 0);
  auVar66._12_4_ = -(uint)(*(int *)((long)r->n + 0x1c) == 0 && *(int *)((long)r->n + 0xc) == 0);
  iVar13 = movmskps(extraout_EAX,auVar66);
  if (iVar13 != 0xf) {
    r_00 = (secp256k1_fe *)auStack_630;
    pcStack_678 = (code *)0x154bb3;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r_00,(secp256k1_scalar *)r,(secp256k1_scalar *)auStack_670);
    pcStack_678 = (code *)0x154bbb;
    psVar35 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if (((auStack_630._0_8_ != 1 || auStack_630._8_8_ != 0) || auStack_630._16_8_ != 0) ||
        auStack_630._24_8_ != 0) {
      pcStack_678 = (code *)0x154cc5;
      test_inverse_scalar_cold_1();
      goto LAB_00154cc5;
    }
    pcStack_678 = (code *)0x154beb;
    secp256k1_scalar_add
              ((secp256k1_scalar *)(auStack_670 + 0x20),(secp256k1_scalar *)r,&scalar_minus_one);
    pcStack_678 = (code *)0x154bf3;
    secp256k1_scalar_verify((secp256k1_scalar *)(auStack_670 + 0x20));
    auVar67._0_4_ = -(uint)(iStack_640 == 0 && auStack_670._32_4_ == 0);
    auVar67._4_4_ = -(uint)(iStack_63c == 0 && iStack_64c == 0);
    auVar67._8_4_ = -(uint)(iStack_638 == 0 && iStack_648 == 0);
    auVar67._12_4_ = -(uint)(iStack_634 == 0 && iStack_644 == 0);
    iVar13 = movmskps(extraout_EAX_00,auVar67);
    if (iVar13 == 0xf) {
      return;
    }
    a = (secp256k1_scalar *)(auStack_670 + 0x20);
    pcStack_678 = (code *)0x154c24;
    (*pcVar56)(a,a);
    pcStack_678 = (code *)0x154c39;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_670,&scalar_minus_one,(secp256k1_scalar *)auStack_670);
    pcStack_678 = (code *)0x154c42;
    (*pcVar56)(auStack_670,auStack_670);
    pcStack_678 = (code *)0x154c54;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_670,(secp256k1_scalar *)auStack_670,&secp256k1_scalar_one
              );
    pcStack_678 = (code *)0x154c62;
    secp256k1_scalar_add((secp256k1_scalar *)auStack_670,a,(secp256k1_scalar *)auStack_670);
    pcStack_678 = (code *)0x154c6a;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_670);
    auVar68._0_4_ = -(uint)(auStack_670._16_4_ == 0 && auStack_670._0_4_ == 0);
    auVar68._4_4_ = -(uint)(auStack_670._20_4_ == 0 && auStack_670._4_4_ == 0);
    auVar68._8_4_ = -(uint)(auStack_670._24_4_ == 0 && auStack_670._8_4_ == 0);
    auVar68._12_4_ = -(uint)(auStack_670._28_4_ == 0 && auStack_670._12_4_ == 0);
    iVar13 = movmskps(extraout_EAX_01,auVar68);
    if (iVar13 == 0xf) {
      return;
    }
    pcStack_678 = (code *)0x154c8e;
    test_inverse_scalar_cold_2();
    r_00 = (secp256k1_fe *)auStack_670;
  }
  pcStack_678 = (code *)0x154c99;
  secp256k1_scalar_verify((secp256k1_scalar *)auStack_670);
  auVar69._0_4_ = -(uint)(auStack_670._16_4_ == 0 && auStack_670._0_4_ == 0);
  auVar69._4_4_ = -(uint)(auStack_670._20_4_ == 0 && auStack_670._4_4_ == 0);
  auVar69._8_4_ = -(uint)(auStack_670._24_4_ == 0 && auStack_670._8_4_ == 0);
  auVar69._12_4_ = -(uint)(auStack_670._28_4_ == 0 && auStack_670._12_4_ == 0);
  iVar13 = movmskps(extraout_EAX_02,auVar69);
  r = (secp256k1_fe *)auStack_670;
  psVar35 = psVar42;
  if (iVar13 == 0xf) {
    return;
  }
LAB_00154cc5:
  pcStack_678 = test_hsort;
  test_inverse_scalar_cold_3();
  __s = auStack_1728;
  psStack_6a0 = r;
  uStack_698 = uVar47;
  uStack_690 = uVar16;
  psStack_688 = r_00;
  pcStack_680 = pcVar56;
  pcStack_678 = (code *)uVar33;
  memset(__s,0,0x1081);
  uStack_1738 = 0;
  lVar53 = 0x41;
  psStack_1730 = psVar35;
  secp256k1_hsort(__s,0x41,(size_t)psVar35,test_hsort_cmp,&uStack_1738);
  if (0x3f < uStack_1738) {
    test_hsort_is_sorted(auStack_1728,0x41,(size_t)psVar35);
    if (0 < COUNT) {
      iVar13 = 0;
      do {
        uVar15 = testrand_int(0x41);
        count = (size_t)(int)uVar15;
        testrand_bytes_test(auStack_1728,count * (long)psVar35);
        secp256k1_hsort(auStack_1728,count,(size_t)psVar35,test_hsort_cmp,&uStack_1738);
        test_hsort_is_sorted(auStack_1728,count,(size_t)psVar35);
        iVar13 = iVar13 + 1;
      } while (iVar13 < COUNT);
    }
    return;
  }
  test_hsort_cold_1();
  *extraout_RDX_01 = *extraout_RDX_01 + 1;
  if (extraout_RDX_01[1] != 0) {
    lVar21 = 0;
    do {
      if (__s[lVar21] != *(uchar *)(lVar53 + lVar21)) {
        return;
      }
      lVar21 = lVar21 + 1;
    } while (extraout_RDX_01[1] != lVar21);
  }
  return;
LAB_00152e3c:
  pcStack_f0 = (code *)0x152e41;
  test_modinv64_uint16_cold_5();
LAB_00152e41:
  pcStack_f0 = (code *)0x152e46;
  test_modinv64_uint16_cold_3();
LAB_00152e46:
  pcStack_f0 = (code *)0x152e4b;
  test_modinv64_uint16_cold_1();
  psVar28 = psVar38;
LAB_00152e4b:
  psVar39 = psVar28;
  pcStack_f0 = (code *)0x152e50;
  test_modinv64_uint16_cold_6();
  goto LAB_00152e50;
}

Assistant:

static void test_modinv64_uint16(uint16_t* out, const uint16_t* in, const uint16_t* mod) {
    static const int64_t M62 = (int64_t)(UINT64_MAX >> 2);
    uint16_t tmp[16];
    secp256k1_modinv64_signed62 x;
    secp256k1_modinv64_modinfo m;
    int i, vartime, nonzero;

    uint16_to_signed62(&x, in);
    nonzero = (x.v[0] | x.v[1] | x.v[2] | x.v[3] | x.v[4]) != 0;
    uint16_to_signed62(&m.modulus, mod);

    /* compute 1/modulus mod 2^62 */
    m.modulus_inv62 = modinv2p64(m.modulus.v[0]) & M62;
    CHECK(((m.modulus_inv62 * m.modulus.v[0]) & M62) == 1);

    /* Test secp256k1_jacobi64_maybe_var. */
    if (nonzero) {
        int jac;
        uint16_t sqr[16], negone[16];
        mulmod256(sqr, in, in, mod);
        uint16_to_signed62(&x, sqr);
        /* Compute jacobi symbol of in^2, which must be 1 (or uncomputable). */
        jac = secp256k1_jacobi64_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1);
        /* Then compute the jacobi symbol of -(in^2). x and -x have opposite
         * jacobi symbols if and only if (mod % 4) == 3. */
        negone[0] = mod[0] - 1;
        for (i = 1; i < 16; ++i) negone[i] = mod[i];
        mulmod256(sqr, sqr, negone, mod);
        uint16_to_signed62(&x, sqr);
        jac = secp256k1_jacobi64_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1 - (mod[0] & 2));
    }

    uint16_to_signed62(&x, in);
    mutate_sign_signed62(&m.modulus);
    for (vartime = 0; vartime < 2; ++vartime) {
        /* compute inverse */
        (vartime ? secp256k1_modinv64_var : secp256k1_modinv64)(&x, &m);

        /* produce output */
        signed62_to_uint16(out, &x);

        /* check if the inverse times the input is 1 (mod m), unless x is 0. */
        mulmod256(tmp, out, in, mod);
        CHECK(tmp[0] == nonzero);
        for (i = 1; i < 16; ++i) CHECK(tmp[i] == 0);

        /* invert again */
        (vartime ? secp256k1_modinv64_var : secp256k1_modinv64)(&x, &m);

        /* check if the result is equal to the input */
        signed62_to_uint16(tmp, &x);
        for (i = 0; i < 16; ++i) CHECK(tmp[i] == in[i]);
    }
}